

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  float fVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [12];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  byte bVar52;
  byte bVar53;
  byte bVar54;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  long lVar55;
  byte bVar56;
  ulong uVar57;
  ulong uVar58;
  byte bVar59;
  long lVar60;
  bool bVar61;
  ulong uVar62;
  uint uVar63;
  uint uVar135;
  uint uVar136;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  uint uVar138;
  uint uVar139;
  uint uVar140;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  uint uVar137;
  uint uVar141;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar142;
  float fVar159;
  float fVar160;
  vint4 bi_2;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined4 uVar165;
  vint4 bi_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar179 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  float fVar185;
  float fVar186;
  float fVar207;
  float fVar208;
  vint4 bi;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar209;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar217 [32];
  float fVar229;
  vint4 ai;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar230;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  vint4 ai_1;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar236;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  vint4 ai_2;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  float fVar243;
  undefined1 auVar244 [32];
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar245 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [28];
  float fVar252;
  undefined1 auVar251 [32];
  undefined1 auVar253 [64];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [64];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_a20;
  undefined1 local_860 [16];
  uint local_850;
  uint local_84c;
  float local_848;
  float local_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_770 [16];
  ulong local_758;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  Primitive *local_5d0;
  ulong local_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  RTCHitN local_4e0 [16];
  undefined1 auStack_4d0 [16];
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  float local_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [16];
  undefined8 local_490;
  undefined8 uStack_488;
  undefined1 local_480 [16];
  uint local_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  uint uStack_460;
  uint uStack_45c;
  uint uStack_458;
  uint uStack_454;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  
  uVar62 = (ulong)(byte)prim[1];
  lVar55 = uVar62 * 0x25;
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xf + 6)));
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x11 + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1a + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1b + 6)));
  auVar64 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar55 + 0x12)));
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar65 = vsubps_avx512vl(auVar76,*(undefined1 (*) [16])(prim + lVar55 + 6));
  auVar66 = vpmovsxbd_avx512vl(ZEXT416(*(uint *)(prim + uVar62 * 0x1c + 6)));
  fVar16 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar55 + 0x16)) *
           *(float *)(prim + lVar55 + 0x1a);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar18 = vpmovsxwd_avx(auVar76);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar62 * 0xb + 6);
  auVar143 = vpmovsxwd_avx(auVar80);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar167 = vpmovsxwd_avx(auVar77);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar62 * 0xd + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar62 * 0x12 + 6);
  auVar2 = vpmovsxwd_avx(auVar2);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar62 * 0x16 + 6);
  auVar83 = vpmovsxwd_avx(auVar83);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar62 * 0x14 + 6);
  auVar82 = vpmovsxwd_avx(auVar82);
  auVar76 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar76 = vinsertps_avx512f(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar65 = vmulps_avx512vl(auVar64,auVar65);
  auVar64 = vmulps_avx512vl(auVar64,auVar76);
  auVar67 = vcvtdq2ps_avx512vl(auVar73);
  auVar68 = vcvtdq2ps_avx512vl(auVar68);
  auVar69 = vcvtdq2ps_avx512vl(auVar69);
  auVar70 = vcvtdq2ps_avx512vl(auVar70);
  auVar71 = vcvtdq2ps_avx512vl(auVar71);
  auVar76 = vcvtdq2ps_avx(auVar72);
  auVar80 = vcvtdq2ps_avx(auVar74);
  auVar77 = vcvtdq2ps_avx(auVar75);
  auVar72 = vcvtdq2ps_avx512vl(auVar66);
  auVar73 = vbroadcastss_avx512vl(auVar64);
  auVar74 = vshufps_avx512vl(auVar64,auVar64,0x55);
  auVar75 = vshufps_avx512vl(auVar64,auVar64,0xaa);
  auVar64 = vmulps_avx512vl(auVar75,auVar69);
  auVar166._0_4_ = auVar75._0_4_ * auVar76._0_4_;
  auVar166._4_4_ = auVar75._4_4_ * auVar76._4_4_;
  auVar166._8_4_ = auVar75._8_4_ * auVar76._8_4_;
  auVar166._12_4_ = auVar75._12_4_ * auVar76._12_4_;
  auVar66._0_4_ = auVar72._0_4_ * auVar75._0_4_;
  auVar66._4_4_ = auVar72._4_4_ * auVar75._4_4_;
  auVar66._8_4_ = auVar72._8_4_ * auVar75._8_4_;
  auVar66._12_4_ = auVar72._12_4_ * auVar75._12_4_;
  auVar75 = vfmadd231ps_avx512vl(auVar64,auVar74,auVar68);
  auVar64 = vfmadd231ps_avx512vl(auVar166,auVar74,auVar71);
  auVar74 = vfmadd231ps_avx512vl(auVar66,auVar77,auVar74);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar73,auVar67);
  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar73,auVar70);
  auVar73 = vfmadd231ps_fma(auVar74,auVar80,auVar73);
  auVar74 = vbroadcastss_avx512vl(auVar65);
  auVar66 = vshufps_avx512vl(auVar65,auVar65,0x55);
  auVar65 = vshufps_avx512vl(auVar65,auVar65,0xaa);
  auVar69 = vmulps_avx512vl(auVar65,auVar69);
  auVar76 = vmulps_avx512vl(auVar65,auVar76);
  auVar72 = vmulps_avx512vl(auVar65,auVar72);
  auVar68 = vfmadd231ps_avx512vl(auVar69,auVar66,auVar68);
  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar66,auVar71);
  auVar77 = vfmadd231ps_avx512vl(auVar72,auVar66,auVar77);
  auVar65 = vfmadd231ps_avx512vl(auVar68,auVar74,auVar67);
  auVar66 = vfmadd231ps_avx512vl(auVar76,auVar74,auVar70);
  auVar67 = vfmadd231ps_avx512vl(auVar77,auVar74,auVar80);
  auVar262._8_4_ = 0x7fffffff;
  auVar262._0_8_ = 0x7fffffff7fffffff;
  auVar262._12_4_ = 0x7fffffff;
  auVar76 = vandps_avx(auVar262,auVar75);
  auVar259._8_4_ = 0x219392ef;
  auVar259._0_8_ = 0x219392ef219392ef;
  auVar259._12_4_ = 0x219392ef;
  uVar57 = vcmpps_avx512vl(auVar76,auVar259,1);
  bVar61 = (bool)((byte)uVar57 & 1);
  auVar78._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._0_4_;
  bVar61 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._4_4_;
  bVar61 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._8_4_;
  bVar61 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._12_4_;
  auVar76 = vandps_avx(auVar262,auVar64);
  uVar57 = vcmpps_avx512vl(auVar76,auVar259,1);
  bVar61 = (bool)((byte)uVar57 & 1);
  auVar79._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar64._0_4_;
  bVar61 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar64._4_4_;
  bVar61 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar64._8_4_;
  bVar61 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar64._12_4_;
  auVar76 = vandps_avx(auVar262,auVar73);
  uVar57 = vcmpps_avx512vl(auVar76,auVar259,1);
  bVar61 = (bool)((byte)uVar57 & 1);
  auVar64._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar73._0_4_;
  bVar61 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar73._4_4_;
  bVar61 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar73._8_4_;
  bVar61 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar73._12_4_;
  auVar80 = vrcp14ps_avx512vl(auVar78);
  auVar260._8_4_ = 0x3f800000;
  auVar260._0_8_ = 0x3f8000003f800000;
  auVar260._12_4_ = 0x3f800000;
  auVar76 = vfnmadd213ps_fma(auVar78,auVar80,auVar260);
  auVar77 = vfmadd132ps_fma(auVar76,auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar79);
  auVar76 = vfnmadd213ps_fma(auVar79,auVar80,auVar260);
  auVar72 = vfmadd132ps_fma(auVar76,auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar64);
  auVar76 = vfnmadd213ps_fma(auVar64,auVar80,auVar260);
  auVar74 = vfmadd132ps_fma(auVar76,auVar80,auVar80);
  auVar221._4_4_ = fVar16;
  auVar221._0_4_ = fVar16;
  auVar221._8_4_ = fVar16;
  auVar221._12_4_ = fVar16;
  auVar76 = vcvtdq2ps_avx(auVar18);
  auVar80 = vcvtdq2ps_avx(auVar143);
  auVar80 = vsubps_avx(auVar80,auVar76);
  auVar75 = vfmadd213ps_fma(auVar80,auVar221,auVar76);
  auVar76 = vcvtdq2ps_avx(auVar167);
  auVar80 = vcvtdq2ps_avx(auVar81);
  auVar80 = vsubps_avx(auVar80,auVar76);
  auVar81 = vfmadd213ps_fma(auVar80,auVar221,auVar76);
  auVar76 = vcvtdq2ps_avx(auVar2);
  auVar80 = vcvtdq2ps_avx(auVar83);
  auVar80 = vsubps_avx(auVar80,auVar76);
  auVar2 = vfmadd213ps_fma(auVar80,auVar221,auVar76);
  auVar76 = vcvtdq2ps_avx(auVar82);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar62 * 0x18 + 6);
  auVar80 = vpmovsxwd_avx(auVar73);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar76);
  auVar83 = vfmadd213ps_fma(auVar80,auVar221,auVar76);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar62 * 0x1d + 6);
  auVar76 = vpmovsxwd_avx(auVar68);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar62 * 0x21 + 6);
  auVar80 = vpmovsxwd_avx(auVar69);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar76);
  auVar82 = vfmadd213ps_fma(auVar80,auVar221,auVar76);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar62 * 0x1f + 6);
  auVar76 = vpmovsxwd_avx(auVar70);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar62 * 0x23 + 6);
  auVar80 = vpmovsxwd_avx(auVar71);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar76);
  auVar80 = vfmadd213ps_fma(auVar80,auVar221,auVar76);
  auVar76 = vsubps_avx512vl(auVar75,auVar65);
  auVar222._0_4_ = auVar77._0_4_ * auVar76._0_4_;
  auVar222._4_4_ = auVar77._4_4_ * auVar76._4_4_;
  auVar222._8_4_ = auVar77._8_4_ * auVar76._8_4_;
  auVar222._12_4_ = auVar77._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx512vl(auVar81,auVar65);
  auVar65._0_4_ = auVar77._0_4_ * auVar76._0_4_;
  auVar65._4_4_ = auVar77._4_4_ * auVar76._4_4_;
  auVar65._8_4_ = auVar77._8_4_ * auVar76._8_4_;
  auVar65._12_4_ = auVar77._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar2,auVar66);
  auVar231._0_4_ = auVar72._0_4_ * auVar76._0_4_;
  auVar231._4_4_ = auVar72._4_4_ * auVar76._4_4_;
  auVar231._8_4_ = auVar72._8_4_ * auVar76._8_4_;
  auVar231._12_4_ = auVar72._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar83,auVar66);
  auVar167._0_4_ = auVar72._0_4_ * auVar76._0_4_;
  auVar167._4_4_ = auVar72._4_4_ * auVar76._4_4_;
  auVar167._8_4_ = auVar72._8_4_ * auVar76._8_4_;
  auVar167._12_4_ = auVar72._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar82,auVar67);
  auVar237._0_4_ = auVar74._0_4_ * auVar76._0_4_;
  auVar237._4_4_ = auVar74._4_4_ * auVar76._4_4_;
  auVar237._8_4_ = auVar74._8_4_ * auVar76._8_4_;
  auVar237._12_4_ = auVar74._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar80,auVar67);
  auVar143._0_4_ = auVar74._0_4_ * auVar76._0_4_;
  auVar143._4_4_ = auVar74._4_4_ * auVar76._4_4_;
  auVar143._8_4_ = auVar74._8_4_ * auVar76._8_4_;
  auVar143._12_4_ = auVar74._12_4_ * auVar76._12_4_;
  auVar76 = vpminsd_avx(auVar222,auVar65);
  auVar80 = vpminsd_avx(auVar231,auVar167);
  auVar76 = vmaxps_avx(auVar76,auVar80);
  auVar80 = vpminsd_avx(auVar237,auVar143);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar72._4_4_ = uVar165;
  auVar72._0_4_ = uVar165;
  auVar72._8_4_ = uVar165;
  auVar72._12_4_ = uVar165;
  auVar80 = vmaxps_avx512vl(auVar80,auVar72);
  auVar76 = vmaxps_avx(auVar76,auVar80);
  auVar74._8_4_ = 0x3f7ffffa;
  auVar74._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar74._12_4_ = 0x3f7ffffa;
  local_380 = vmulps_avx512vl(auVar76,auVar74);
  auVar76 = vpmaxsd_avx(auVar222,auVar65);
  auVar80 = vpmaxsd_avx(auVar231,auVar167);
  auVar76 = vminps_avx(auVar76,auVar80);
  auVar80 = vpmaxsd_avx(auVar237,auVar143);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar75._4_4_ = uVar165;
  auVar75._0_4_ = uVar165;
  auVar75._8_4_ = uVar165;
  auVar75._12_4_ = uVar165;
  auVar80 = vminps_avx512vl(auVar80,auVar75);
  auVar76 = vminps_avx(auVar76,auVar80);
  auVar18._8_4_ = 0x3f800003;
  auVar18._0_8_ = 0x3f8000033f800003;
  auVar18._12_4_ = 0x3f800003;
  auVar76 = vmulps_avx512vl(auVar76,auVar18);
  auVar80 = vpbroadcastd_avx512vl();
  uVar19 = vcmpps_avx512vl(local_380,auVar76,2);
  uVar21 = vpcmpgtd_avx512vl(auVar80,_DAT_01f4ad30);
  local_5c8 = (ulong)((byte)uVar19 & 0xf & (byte)uVar21);
  local_510 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar235 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  local_5d0 = prim;
LAB_018d1fae:
  if (local_5c8 == 0) {
LAB_018d49cc:
    return local_5c8 != 0;
  }
  lVar55 = 0;
  for (uVar57 = local_5c8; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    lVar55 = lVar55 + 1;
  }
  local_758 = (ulong)*(uint *)(local_5d0 + 2);
  pGVar3 = (context->scene->geometries).items[local_758].ptr;
  uVar57 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(local_5d0 + lVar55 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar16 = (pGVar3->time_range).lower;
  fVar16 = pGVar3->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar16) / ((pGVar3->time_range).upper - fVar16));
  auVar76 = vroundss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16),9);
  auVar76 = vminss_avx(auVar76,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar76 = vmaxss_avx(ZEXT816(0) << 0x20,auVar76);
  fVar16 = fVar16 - auVar76._0_4_;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar60 = (long)(int)auVar76._0_4_ * 0x38;
  lVar55 = *(long *)(_Var4 + 0x10 + lVar60);
  lVar5 = *(long *)(_Var4 + 0x38 + lVar60);
  lVar6 = *(long *)(_Var4 + 0x48 + lVar60);
  pfVar1 = (float *)(lVar5 + uVar57 * lVar6);
  auVar144._0_4_ = fVar16 * *pfVar1;
  auVar144._4_4_ = fVar16 * pfVar1[1];
  auVar144._8_4_ = fVar16 * pfVar1[2];
  auVar144._12_4_ = fVar16 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar57 + 1) * lVar6);
  auVar168._0_4_ = fVar16 * *pfVar1;
  auVar168._4_4_ = fVar16 * pfVar1[1];
  auVar168._8_4_ = fVar16 * pfVar1[2];
  auVar168._12_4_ = fVar16 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar57 + 2) * lVar6);
  auVar187._0_4_ = fVar16 * *pfVar1;
  auVar187._4_4_ = fVar16 * pfVar1[1];
  auVar187._8_4_ = fVar16 * pfVar1[2];
  auVar187._12_4_ = fVar16 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + lVar6 * (uVar57 + 3));
  auVar210._0_4_ = fVar16 * *pfVar1;
  auVar210._4_4_ = fVar16 * pfVar1[1];
  auVar210._8_4_ = fVar16 * pfVar1[2];
  auVar210._12_4_ = fVar16 * pfVar1[3];
  lVar5 = *(long *)(_Var4 + lVar60);
  auVar98 = auVar235._0_32_;
  auVar245 = ZEXT3264(auVar98);
  fVar16 = 1.0 - fVar16;
  auVar223._4_4_ = fVar16;
  auVar223._0_4_ = fVar16;
  auVar223._8_4_ = fVar16;
  auVar223._12_4_ = fVar16;
  auVar77 = vfmadd231ps_fma(auVar144,auVar223,*(undefined1 (*) [16])(lVar5 + lVar55 * uVar57));
  auVar81 = vfmadd231ps_fma(auVar168,auVar223,*(undefined1 (*) [16])(lVar5 + lVar55 * (uVar57 + 1)))
  ;
  auVar2 = vfmadd231ps_fma(auVar187,auVar223,*(undefined1 (*) [16])(lVar5 + lVar55 * (uVar57 + 2)));
  auVar83 = vfmadd231ps_fma(auVar210,auVar223,*(undefined1 (*) [16])(lVar5 + lVar55 * (uVar57 + 3)))
  ;
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar80 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar258._4_4_ = uVar165;
  auVar258._0_4_ = uVar165;
  auVar258._8_4_ = uVar165;
  auVar258._12_4_ = uVar165;
  local_400._16_4_ = uVar165;
  local_400._0_16_ = auVar258;
  local_400._20_4_ = uVar165;
  local_400._24_4_ = uVar165;
  local_400._28_4_ = uVar165;
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar261._4_4_ = uVar165;
  auVar261._0_4_ = uVar165;
  auVar261._8_4_ = uVar165;
  auVar261._12_4_ = uVar165;
  local_420._16_4_ = uVar165;
  local_420._0_16_ = auVar261;
  local_420._20_4_ = uVar165;
  local_420._24_4_ = uVar165;
  local_420._28_4_ = uVar165;
  auVar76 = vunpcklps_avx(auVar258,auVar261);
  local_440 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar68 = local_440._0_16_;
  local_6d0 = vinsertps_avx512f(auVar76,auVar68,0x28);
  auVar232._0_4_ = auVar77._0_4_ + auVar81._0_4_ + auVar2._0_4_ + auVar83._0_4_;
  auVar232._4_4_ = auVar77._4_4_ + auVar81._4_4_ + auVar2._4_4_ + auVar83._4_4_;
  auVar232._8_4_ = auVar77._8_4_ + auVar81._8_4_ + auVar2._8_4_ + auVar83._8_4_;
  auVar232._12_4_ = auVar77._12_4_ + auVar81._12_4_ + auVar2._12_4_ + auVar83._12_4_;
  auVar67._8_4_ = 0x3e800000;
  auVar67._0_8_ = 0x3e8000003e800000;
  auVar67._12_4_ = 0x3e800000;
  auVar76 = vmulps_avx512vl(auVar232,auVar67);
  auVar76 = vsubps_avx(auVar76,auVar80);
  auVar76 = vdpps_avx(auVar76,local_6d0,0x7f);
  local_4f0 = vpbroadcastd_avx512vl();
  local_6e0 = vdpps_avx(local_6d0,local_6d0,0x7f);
  auVar253 = ZEXT1664(local_6e0);
  fVar16 = *(float *)(ray + k * 4 + 0x30);
  auVar257 = ZEXT464((uint)fVar16);
  auVar238._4_12_ = ZEXT812(0) << 0x20;
  auVar238._0_4_ = local_6e0._0_4_;
  auVar73 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar238);
  auVar82 = vfnmadd213ss_fma(auVar73,local_6e0,ZEXT416(0x40000000));
  local_2e0 = auVar76._0_4_ * auVar73._0_4_ * auVar82._0_4_;
  auVar235 = ZEXT464((uint)local_2e0);
  auVar239._4_4_ = local_2e0;
  auVar239._0_4_ = local_2e0;
  auVar239._8_4_ = local_2e0;
  auVar239._12_4_ = local_2e0;
  fStack_3d0 = local_2e0;
  _local_3e0 = auVar239;
  fStack_3cc = local_2e0;
  fStack_3c8 = local_2e0;
  fStack_3c4 = local_2e0;
  auVar76 = vfmadd231ps_fma(auVar80,local_6d0,auVar239);
  auVar76 = vblendps_avx(auVar76,ZEXT816(0) << 0x40,8);
  auVar80 = vsubps_avx(auVar77,auVar76);
  auVar77 = vsubps_avx(auVar2,auVar76);
  auVar242 = ZEXT1664(auVar77);
  auVar81 = vsubps_avx(auVar81,auVar76);
  auVar249 = ZEXT1664(auVar81);
  auVar76 = vsubps_avx(auVar83,auVar76);
  auVar84 = vbroadcastss_avx512vl(auVar80);
  auVar97._8_4_ = 1;
  auVar97._0_8_ = 0x100000001;
  auVar97._12_4_ = 1;
  auVar97._16_4_ = 1;
  auVar97._20_4_ = 1;
  auVar97._24_4_ = 1;
  auVar97._28_4_ = 1;
  local_660 = ZEXT1632(auVar80);
  auVar85 = vpermps_avx512vl(auVar97,local_660);
  auVar94._8_4_ = 2;
  auVar94._0_8_ = 0x200000002;
  auVar94._12_4_ = 2;
  auVar94._16_4_ = 2;
  auVar94._20_4_ = 2;
  auVar94._24_4_ = 2;
  auVar94._28_4_ = 2;
  auVar86 = vpermps_avx512vl(auVar94,local_660);
  auVar95._8_4_ = 3;
  auVar95._0_8_ = 0x300000003;
  auVar95._12_4_ = 3;
  auVar95._16_4_ = 3;
  auVar95._20_4_ = 3;
  auVar95._24_4_ = 3;
  auVar95._28_4_ = 3;
  auVar87 = vpermps_avx512vl(auVar95,local_660);
  auVar88 = vbroadcastss_avx512vl(auVar81);
  local_6a0 = ZEXT1632(auVar81);
  auVar89 = vpermps_avx512vl(auVar97,local_6a0);
  auVar90 = vpermps_avx512vl(auVar94,local_6a0);
  auVar91 = vpermps_avx512vl(auVar95,local_6a0);
  auVar92 = vbroadcastss_avx512vl(auVar77);
  local_680 = ZEXT1632(auVar77);
  local_800 = vpermps_avx512vl(auVar97,local_680);
  auVar264 = ZEXT3264(local_800);
  local_820 = vpermps_avx512vl(auVar94,local_680);
  auVar265 = ZEXT3264(local_820);
  auVar93 = vpermps_avx512vl(auVar95,local_680);
  local_260 = vbroadcastss_avx512vl(auVar76);
  _local_6c0 = ZEXT1632(auVar76);
  local_280 = vpermps_avx512vl(auVar97,_local_6c0);
  local_2a0 = vpermps_avx2(auVar94,_local_6c0);
  local_2c0 = vpermps_avx2(auVar95,_local_6c0);
  auVar76 = vmulss_avx512f(auVar68,auVar68);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_420,local_420);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_400,local_400);
  local_220._0_4_ = auVar76._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  local_240 = vandps_avx(auVar98,local_220);
  local_620 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar16 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  uVar57 = 0;
  bVar54 = 0;
  local_a20 = 1;
  local_500 = vpbroadcastd_avx512vl();
  auVar76 = vsqrtss_avx(local_6e0,local_6e0);
  local_844 = auVar76._0_4_;
  auVar76 = vsqrtss_avx(local_6e0,local_6e0);
  local_848 = auVar76._0_4_;
  auVar184 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    local_370 = auVar184._0_16_;
    auVar76 = vmovshdup_avx(local_370);
    auVar76 = vsubps_avx(auVar76,local_370);
    auVar145._0_4_ = auVar76._0_4_;
    fVar17 = auVar145._0_4_ * 0.04761905;
    uVar165 = auVar184._0_4_;
    auVar228._4_4_ = uVar165;
    auVar228._0_4_ = uVar165;
    auVar228._8_4_ = uVar165;
    auVar228._12_4_ = uVar165;
    auVar228._16_4_ = uVar165;
    auVar228._20_4_ = uVar165;
    auVar228._24_4_ = uVar165;
    auVar228._28_4_ = uVar165;
    auVar145._4_4_ = auVar145._0_4_;
    auVar145._8_4_ = auVar145._0_4_;
    auVar145._12_4_ = auVar145._0_4_;
    local_700._16_4_ = auVar145._0_4_;
    local_700._0_16_ = auVar145;
    local_700._20_4_ = auVar145._0_4_;
    local_700._24_4_ = auVar145._0_4_;
    local_700._28_4_ = auVar145._0_4_;
    auVar76 = vfmadd231ps_fma(auVar228,local_700,_DAT_01f7b040);
    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar95 = vsubps_avx512vl(auVar94,ZEXT1632(auVar76));
    fVar243 = auVar95._0_4_;
    fVar247 = auVar95._4_4_;
    fVar218 = auVar95._8_4_;
    fVar220 = auVar95._12_4_;
    fVar230 = auVar95._16_4_;
    fVar186 = auVar95._20_4_;
    fVar15 = auVar95._24_4_;
    fVar142 = fVar243 * fVar243 * fVar243;
    fVar159 = fVar247 * fVar247 * fVar247;
    auVar98._4_4_ = fVar159;
    auVar98._0_4_ = fVar142;
    fVar160 = fVar218 * fVar218 * fVar218;
    auVar98._8_4_ = fVar160;
    fVar161 = fVar220 * fVar220 * fVar220;
    auVar98._12_4_ = fVar161;
    fVar162 = fVar230 * fVar230 * fVar230;
    auVar98._16_4_ = fVar162;
    fVar163 = fVar186 * fVar186 * fVar186;
    auVar98._20_4_ = fVar163;
    fVar164 = fVar15 * fVar15 * fVar15;
    auVar98._24_4_ = fVar164;
    auVar98._28_4_ = auVar145._0_4_;
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar97 = vmulps_avx512vl(auVar98,auVar96);
    fVar246 = auVar76._0_4_;
    fVar248 = auVar76._4_4_;
    fVar219 = auVar76._8_4_;
    fVar229 = auVar76._12_4_;
    fVar185 = fVar246 * fVar246 * fVar246;
    fVar207 = fVar248 * fVar248 * fVar248;
    fVar208 = fVar219 * fVar219 * fVar219;
    fVar209 = fVar229 * fVar229 * fVar229;
    auVar118._28_4_ = DAT_01f7b040._28_4_;
    auVar118._0_28_ = ZEXT1628(CONCAT412(fVar209,CONCAT48(fVar208,CONCAT44(fVar207,fVar185))));
    auVar184._0_4_ = fVar246 * fVar243;
    auVar184._4_4_ = fVar248 * fVar247;
    auVar184._8_4_ = fVar219 * fVar218;
    auVar184._12_4_ = fVar229 * fVar220;
    auVar184._16_4_ = fVar230 * 0.0;
    auVar184._20_4_ = fVar186 * 0.0;
    auVar184._28_36_ = auVar249._28_36_;
    auVar184._24_4_ = fVar15 * 0.0;
    auVar98 = vmulps_avx512vl(auVar118,auVar96);
    fVar252 = auVar98._28_4_ + auVar145._0_4_;
    fVar34 = auVar253._28_4_;
    fVar236 = fVar252 + fVar34 + auVar235._28_4_;
    auVar105._4_4_ = fVar159 * 0.16666667;
    auVar105._0_4_ = fVar142 * 0.16666667;
    auVar105._8_4_ = fVar160 * 0.16666667;
    auVar105._12_4_ = fVar161 * 0.16666667;
    auVar105._16_4_ = fVar162 * 0.16666667;
    auVar105._20_4_ = fVar163 * 0.16666667;
    auVar105._24_4_ = fVar164 * 0.16666667;
    auVar105._28_4_ = fVar252;
    auVar101._4_4_ =
         (auVar184._4_4_ * fVar247 * 12.0 + auVar184._4_4_ * fVar248 * 6.0 + fVar207 + auVar97._4_4_
         ) * 0.16666667;
    auVar101._0_4_ =
         (auVar184._0_4_ * fVar243 * 12.0 + auVar184._0_4_ * fVar246 * 6.0 + fVar185 + auVar97._0_4_
         ) * 0.16666667;
    auVar101._8_4_ =
         (auVar184._8_4_ * fVar218 * 12.0 + auVar184._8_4_ * fVar219 * 6.0 + fVar208 + auVar97._8_4_
         ) * 0.16666667;
    auVar101._12_4_ =
         (auVar184._12_4_ * fVar220 * 12.0 + auVar184._12_4_ * fVar229 * 6.0 +
         fVar209 + auVar97._12_4_) * 0.16666667;
    auVar101._16_4_ =
         (auVar184._16_4_ * fVar230 * 12.0 + auVar184._16_4_ * 0.0 * 6.0 + auVar97._16_4_ + 0.0) *
         0.16666667;
    auVar101._20_4_ =
         (auVar184._20_4_ * fVar186 * 12.0 + auVar184._20_4_ * 0.0 * 6.0 + auVar97._20_4_ + 0.0) *
         0.16666667;
    auVar101._24_4_ =
         (auVar184._24_4_ * fVar15 * 12.0 + auVar184._24_4_ * 0.0 * 6.0 + auVar97._24_4_ + 0.0) *
         0.16666667;
    auVar101._28_4_ = fVar34;
    auVar102._4_4_ =
         (auVar98._4_4_ + fVar159 + auVar184._4_4_ * fVar248 * 12.0 + auVar184._4_4_ * fVar247 * 6.0
         ) * 0.16666667;
    auVar102._0_4_ =
         (auVar98._0_4_ + fVar142 + auVar184._0_4_ * fVar246 * 12.0 + auVar184._0_4_ * fVar243 * 6.0
         ) * 0.16666667;
    auVar102._8_4_ =
         (auVar98._8_4_ + fVar160 + auVar184._8_4_ * fVar219 * 12.0 + auVar184._8_4_ * fVar218 * 6.0
         ) * 0.16666667;
    auVar102._12_4_ =
         (auVar98._12_4_ + fVar161 +
         auVar184._12_4_ * fVar229 * 12.0 + auVar184._12_4_ * fVar220 * 6.0) * 0.16666667;
    auVar102._16_4_ =
         (auVar98._16_4_ + fVar162 + auVar184._16_4_ * 0.0 * 12.0 + auVar184._16_4_ * fVar230 * 6.0)
         * 0.16666667;
    auVar102._20_4_ =
         (auVar98._20_4_ + fVar163 + auVar184._20_4_ * 0.0 * 12.0 + auVar184._20_4_ * fVar186 * 6.0)
         * 0.16666667;
    auVar102._24_4_ =
         (auVar98._24_4_ + fVar164 + auVar184._24_4_ * 0.0 * 12.0 + auVar184._24_4_ * fVar15 * 6.0)
         * 0.16666667;
    auVar102._28_4_ = auVar257._28_4_;
    fVar185 = fVar185 * 0.16666667;
    fVar207 = fVar207 * 0.16666667;
    fVar208 = fVar208 * 0.16666667;
    fVar209 = fVar209 * 0.16666667;
    auVar103._28_4_ = fVar236;
    auVar103._0_28_ = ZEXT1628(CONCAT412(fVar209,CONCAT48(fVar208,CONCAT44(fVar207,fVar185))));
    auVar97 = vmulps_avx512vl(local_260,auVar103);
    auVar98 = vmulps_avx512vl(local_280,auVar103);
    auVar104._4_4_ = local_2a0._4_4_ * fVar207;
    auVar104._0_4_ = local_2a0._0_4_ * fVar185;
    auVar104._8_4_ = local_2a0._8_4_ * fVar208;
    auVar104._12_4_ = local_2a0._12_4_ * fVar209;
    auVar104._16_4_ = local_2a0._16_4_ * 0.0;
    auVar104._20_4_ = local_2a0._20_4_ * 0.0;
    auVar104._24_4_ = local_2a0._24_4_ * 0.0;
    auVar104._28_4_ = auVar145._0_4_;
    auVar106._4_4_ = local_2c0._4_4_ * fVar207;
    auVar106._0_4_ = local_2c0._0_4_ * fVar185;
    auVar106._8_4_ = local_2c0._8_4_ * fVar208;
    auVar106._12_4_ = local_2c0._12_4_ * fVar209;
    auVar106._16_4_ = local_2c0._16_4_ * 0.0;
    auVar106._20_4_ = local_2c0._20_4_ * 0.0;
    auVar106._24_4_ = local_2c0._24_4_ * 0.0;
    auVar106._28_4_ = fVar236;
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,auVar92);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar264._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar104,auVar102,auVar265._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar106,auVar93,auVar102);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar88);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,auVar89);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar101,auVar90);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar91,auVar101);
    auVar101 = vfmadd231ps_avx512vl(auVar97,auVar105,auVar84);
    auVar102 = vfmadd231ps_avx512vl(auVar98,auVar105,auVar85);
    auVar103 = vfmadd231ps_avx512vl(auVar99,auVar105,auVar86);
    auVar98 = vfmadd231ps_avx512vl(auVar100,auVar87,auVar105);
    auVar104 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar105 = vxorps_avx512vl(auVar95,auVar104);
    auVar97 = vxorps_avx512vl(ZEXT1632(auVar76),auVar104);
    auVar119._0_4_ = auVar97._0_4_ * fVar246;
    auVar119._4_4_ = auVar97._4_4_ * fVar248;
    auVar119._8_4_ = auVar97._8_4_ * fVar219;
    auVar119._12_4_ = auVar97._12_4_ * fVar229;
    auVar119._16_4_ = auVar97._16_4_ * 0.0;
    auVar119._20_4_ = auVar97._20_4_ * 0.0;
    auVar119._24_4_ = auVar97._24_4_ * 0.0;
    auVar119._28_4_ = 0;
    auVar99 = vmulps_avx512vl(auVar184._0_32_,auVar96);
    auVar97 = vsubps_avx(auVar119,auVar99);
    auVar107._4_4_ = auVar105._4_4_ * fVar247 * 0.5;
    auVar107._0_4_ = auVar105._0_4_ * fVar243 * 0.5;
    auVar107._8_4_ = auVar105._8_4_ * fVar218 * 0.5;
    auVar107._12_4_ = auVar105._12_4_ * fVar220 * 0.5;
    auVar107._16_4_ = auVar105._16_4_ * fVar230 * 0.5;
    auVar107._20_4_ = auVar105._20_4_ * fVar186 * 0.5;
    auVar107._24_4_ = auVar105._24_4_ * fVar15 * 0.5;
    auVar107._28_4_ = auVar95._28_4_;
    auVar108._4_4_ = auVar97._4_4_ * 0.5;
    auVar108._0_4_ = auVar97._0_4_ * 0.5;
    auVar108._8_4_ = auVar97._8_4_ * 0.5;
    auVar108._12_4_ = auVar97._12_4_ * 0.5;
    auVar108._16_4_ = auVar97._16_4_ * 0.5;
    auVar108._20_4_ = auVar97._20_4_ * 0.5;
    auVar108._24_4_ = auVar97._24_4_ * 0.5;
    auVar108._28_4_ = auVar97._28_4_;
    auVar109._4_4_ = (auVar99._4_4_ + fVar247 * fVar247) * 0.5;
    auVar109._0_4_ = (auVar99._0_4_ + fVar243 * fVar243) * 0.5;
    auVar109._8_4_ = (auVar99._8_4_ + fVar218 * fVar218) * 0.5;
    auVar109._12_4_ = (auVar99._12_4_ + fVar220 * fVar220) * 0.5;
    auVar109._16_4_ = (auVar99._16_4_ + fVar230 * fVar230) * 0.5;
    auVar109._20_4_ = (auVar99._20_4_ + fVar186 * fVar186) * 0.5;
    auVar109._24_4_ = (auVar99._24_4_ + fVar15 * fVar15) * 0.5;
    auVar109._28_4_ = auVar99._28_4_ + auVar242._28_4_;
    fVar243 = fVar246 * fVar246 * 0.5;
    fVar246 = fVar248 * fVar248 * 0.5;
    fVar247 = fVar219 * fVar219 * 0.5;
    fVar248 = fVar229 * fVar229 * 0.5;
    auVar110._28_4_ = auVar245._28_4_;
    auVar110._0_28_ = ZEXT1628(CONCAT412(fVar248,CONCAT48(fVar247,CONCAT44(fVar246,fVar243))));
    auVar97 = vmulps_avx512vl(local_260,auVar110);
    auVar95 = vmulps_avx512vl(local_280,auVar110);
    auVar111._4_4_ = local_2a0._4_4_ * fVar246;
    auVar111._0_4_ = local_2a0._0_4_ * fVar243;
    auVar111._8_4_ = local_2a0._8_4_ * fVar247;
    auVar111._12_4_ = local_2a0._12_4_ * fVar248;
    auVar111._16_4_ = local_2a0._16_4_ * 0.0;
    auVar111._20_4_ = local_2a0._20_4_ * 0.0;
    auVar111._24_4_ = local_2a0._24_4_ * 0.0;
    auVar111._28_4_ = fVar34;
    auVar115._4_4_ = fVar246 * local_2c0._4_4_;
    auVar115._0_4_ = fVar243 * local_2c0._0_4_;
    auVar115._8_4_ = fVar247 * local_2c0._8_4_;
    auVar115._12_4_ = fVar248 * local_2c0._12_4_;
    auVar115._16_4_ = local_2c0._16_4_ * 0.0;
    auVar115._20_4_ = local_2c0._20_4_ * 0.0;
    auVar115._24_4_ = local_2c0._24_4_ * 0.0;
    auVar115._28_4_ = auVar245._28_4_;
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar109,auVar92);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,auVar264._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar111,auVar109,auVar265._0_32_);
    auVar76 = vfmadd231ps_fma(auVar115,auVar93,auVar109);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar108,auVar88);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar108,auVar89);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar108,auVar90);
    auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar91,auVar108);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar107,auVar84);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar107,auVar85);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar86);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar87,auVar107);
    auVar123._4_4_ = auVar97._4_4_ * fVar17;
    auVar123._0_4_ = auVar97._0_4_ * fVar17;
    auVar123._8_4_ = auVar97._8_4_ * fVar17;
    auVar123._12_4_ = auVar97._12_4_ * fVar17;
    auVar123._16_4_ = auVar97._16_4_ * fVar17;
    auVar123._20_4_ = auVar97._20_4_ * fVar17;
    auVar123._24_4_ = auVar97._24_4_ * fVar17;
    auVar123._28_4_ = auVar93._28_4_;
    auVar257 = ZEXT3264(auVar123);
    auVar124._4_4_ = auVar95._4_4_ * fVar17;
    auVar124._0_4_ = auVar95._0_4_ * fVar17;
    auVar124._8_4_ = auVar95._8_4_ * fVar17;
    auVar124._12_4_ = auVar95._12_4_ * fVar17;
    auVar124._16_4_ = auVar95._16_4_ * fVar17;
    auVar124._20_4_ = auVar95._20_4_ * fVar17;
    auVar124._24_4_ = auVar95._24_4_ * fVar17;
    auVar124._28_4_ = 0x3e2aaaab;
    auVar125._4_4_ = auVar105._4_4_ * fVar17;
    auVar125._0_4_ = auVar105._0_4_ * fVar17;
    auVar125._8_4_ = auVar105._8_4_ * fVar17;
    auVar125._12_4_ = auVar105._12_4_ * fVar17;
    auVar125._16_4_ = auVar105._16_4_ * fVar17;
    auVar125._20_4_ = auVar105._20_4_ * fVar17;
    auVar125._24_4_ = auVar105._24_4_ * fVar17;
    auVar125._28_4_ = 0x40c00000;
    fVar243 = auVar99._0_4_ * fVar17;
    fVar246 = auVar99._4_4_ * fVar17;
    auVar116._4_4_ = fVar246;
    auVar116._0_4_ = fVar243;
    fVar247 = auVar99._8_4_ * fVar17;
    auVar116._8_4_ = fVar247;
    fVar248 = auVar99._12_4_ * fVar17;
    auVar116._12_4_ = fVar248;
    fVar218 = auVar99._16_4_ * fVar17;
    auVar116._16_4_ = fVar218;
    fVar219 = auVar99._20_4_ * fVar17;
    auVar116._20_4_ = fVar219;
    fVar220 = auVar99._24_4_ * fVar17;
    auVar116._24_4_ = fVar220;
    auVar116._28_4_ = fVar17;
    auVar76 = vxorps_avx512vl(auVar94._0_16_,auVar94._0_16_);
    auVar106 = vpermt2ps_avx512vl(auVar101,_DAT_01fb9fc0,ZEXT1632(auVar76));
    auVar249 = ZEXT3264(auVar106);
    auVar107 = vpermt2ps_avx512vl(auVar102,_DAT_01fb9fc0,ZEXT1632(auVar76));
    auVar95 = ZEXT1632(auVar76);
    auVar108 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,auVar95);
    auVar253 = ZEXT3264(auVar108);
    auVar120._0_4_ = fVar243 + auVar98._0_4_;
    auVar120._4_4_ = fVar246 + auVar98._4_4_;
    auVar120._8_4_ = fVar247 + auVar98._8_4_;
    auVar120._12_4_ = fVar248 + auVar98._12_4_;
    auVar120._16_4_ = fVar218 + auVar98._16_4_;
    auVar120._20_4_ = fVar219 + auVar98._20_4_;
    auVar120._24_4_ = fVar220 + auVar98._24_4_;
    auVar120._28_4_ = fVar17 + auVar98._28_4_;
    auVar97 = vmaxps_avx(auVar98,auVar120);
    auVar94 = vminps_avx(auVar98,auVar120);
    auVar100 = vpermt2ps_avx512vl(auVar98,_DAT_01fb9fc0,auVar95);
    auVar109 = vpermt2ps_avx512vl(auVar123,_DAT_01fb9fc0,auVar95);
    auVar110 = vpermt2ps_avx512vl(auVar124,_DAT_01fb9fc0,auVar95);
    auVar266 = ZEXT1632(auVar76);
    auVar111 = vpermt2ps_avx512vl(auVar125,_DAT_01fb9fc0,auVar266);
    auVar95 = vpermt2ps_avx512vl(auVar116,_DAT_01fb9fc0,auVar266);
    auVar112 = vsubps_avx512vl(auVar100,auVar95);
    auVar95 = vsubps_avx(auVar106,auVar101);
    auVar245 = ZEXT3264(auVar95);
    auVar98 = vsubps_avx(auVar107,auVar102);
    auVar242 = ZEXT3264(auVar98);
    auVar105 = vsubps_avx(auVar108,auVar103);
    auVar99 = vmulps_avx512vl(auVar98,auVar125);
    auVar99 = vfmsub231ps_avx512vl(auVar99,auVar124,auVar105);
    auVar113 = vmulps_avx512vl(auVar105,auVar123);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar125,auVar95);
    auVar114 = vmulps_avx512vl(auVar95,auVar124);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar123,auVar98);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar99,auVar99);
    auVar99 = vmulps_avx512vl(auVar105,auVar105);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar98);
    auVar114 = vfmadd231ps_avx512vl(auVar99,auVar95,auVar95);
    auVar115 = vrcp14ps_avx512vl(auVar114);
    auVar99._8_4_ = 0x3f800000;
    auVar99._0_8_ = 0x3f8000003f800000;
    auVar99._12_4_ = 0x3f800000;
    auVar99._16_4_ = 0x3f800000;
    auVar99._20_4_ = 0x3f800000;
    auVar99._24_4_ = 0x3f800000;
    auVar99._28_4_ = 0x3f800000;
    auVar99 = vfnmadd213ps_avx512vl(auVar115,auVar114,auVar99);
    auVar99 = vfmadd132ps_avx512vl(auVar99,auVar115,auVar115);
    auVar113 = vmulps_avx512vl(auVar113,auVar99);
    auVar115 = vmulps_avx512vl(auVar98,auVar111);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar110,auVar105);
    auVar116 = vmulps_avx512vl(auVar105,auVar109);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar111,auVar95);
    auVar117 = vmulps_avx512vl(auVar95,auVar110);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar109,auVar98);
    auVar117 = vmulps_avx512vl(auVar117,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar99 = vmulps_avx512vl(auVar115,auVar99);
    auVar99 = vmaxps_avx512vl(auVar113,auVar99);
    auVar99 = vsqrtps_avx512vl(auVar99);
    auVar113 = vmaxps_avx512vl(auVar112,auVar100);
    auVar97 = vmaxps_avx512vl(auVar97,auVar113);
    auVar115 = vaddps_avx512vl(auVar99,auVar97);
    auVar97 = vminps_avx512vl(auVar112,auVar100);
    auVar97 = vminps_avx(auVar94,auVar97);
    auVar97 = vsubps_avx512vl(auVar97,auVar99);
    auVar100._8_4_ = 0x3f800002;
    auVar100._0_8_ = 0x3f8000023f800002;
    auVar100._12_4_ = 0x3f800002;
    auVar100._16_4_ = 0x3f800002;
    auVar100._20_4_ = 0x3f800002;
    auVar100._24_4_ = 0x3f800002;
    auVar100._28_4_ = 0x3f800002;
    auVar94 = vmulps_avx512vl(auVar115,auVar100);
    auVar112._8_4_ = 0x3f7ffffc;
    auVar112._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar112._12_4_ = 0x3f7ffffc;
    auVar112._16_4_ = 0x3f7ffffc;
    auVar112._20_4_ = 0x3f7ffffc;
    auVar112._24_4_ = 0x3f7ffffc;
    auVar112._28_4_ = 0x3f7ffffc;
    auVar97 = vmulps_avx512vl(auVar97,auVar112);
    auVar94 = vmulps_avx512vl(auVar94,auVar94);
    auVar99 = vrsqrt14ps_avx512vl(auVar114);
    auVar113._8_4_ = 0xbf000000;
    auVar113._0_8_ = 0xbf000000bf000000;
    auVar113._12_4_ = 0xbf000000;
    auVar113._16_4_ = 0xbf000000;
    auVar113._20_4_ = 0xbf000000;
    auVar113._24_4_ = 0xbf000000;
    auVar113._28_4_ = 0xbf000000;
    auVar100 = vmulps_avx512vl(auVar114,auVar113);
    fVar243 = auVar99._0_4_;
    fVar246 = auVar99._4_4_;
    fVar247 = auVar99._8_4_;
    fVar248 = auVar99._12_4_;
    fVar218 = auVar99._16_4_;
    fVar219 = auVar99._20_4_;
    fVar220 = auVar99._24_4_;
    auVar117._4_4_ = fVar246 * fVar246 * fVar246 * auVar100._4_4_;
    auVar117._0_4_ = fVar243 * fVar243 * fVar243 * auVar100._0_4_;
    auVar117._8_4_ = fVar247 * fVar247 * fVar247 * auVar100._8_4_;
    auVar117._12_4_ = fVar248 * fVar248 * fVar248 * auVar100._12_4_;
    auVar117._16_4_ = fVar218 * fVar218 * fVar218 * auVar100._16_4_;
    auVar117._20_4_ = fVar219 * fVar219 * fVar219 * auVar100._20_4_;
    auVar117._24_4_ = fVar220 * fVar220 * fVar220 * auVar100._24_4_;
    auVar117._28_4_ = auVar115._28_4_;
    auVar114._8_4_ = 0x3fc00000;
    auVar114._0_8_ = 0x3fc000003fc00000;
    auVar114._12_4_ = 0x3fc00000;
    auVar114._16_4_ = 0x3fc00000;
    auVar114._20_4_ = 0x3fc00000;
    auVar114._24_4_ = 0x3fc00000;
    auVar114._28_4_ = 0x3fc00000;
    auVar99 = vfmadd231ps_avx512vl(auVar117,auVar99,auVar114);
    auVar100 = vmulps_avx512vl(auVar95,auVar99);
    auVar112 = vmulps_avx512vl(auVar98,auVar99);
    auVar113 = vmulps_avx512vl(auVar105,auVar99);
    auVar114 = vsubps_avx512vl(auVar266,auVar101);
    auVar115 = vsubps_avx512vl(auVar266,auVar102);
    auVar116 = vsubps_avx512vl(auVar266,auVar103);
    auVar117 = vmulps_avx512vl(local_440,auVar116);
    auVar117 = vfmadd231ps_avx512vl(auVar117,local_420,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,local_400,auVar114);
    auVar118 = vmulps_avx512vl(auVar116,auVar116);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar115,auVar115);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar114,auVar114);
    auVar119 = vmulps_avx512vl(local_440,auVar113);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar112,local_420);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar100,local_400);
    auVar113 = vmulps_avx512vl(auVar116,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar115,auVar112);
    auVar100 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar100);
    auVar112 = vmulps_avx512vl(auVar119,auVar119);
    auVar113 = vsubps_avx512vl(local_220,auVar112);
    auVar120 = vmulps_avx512vl(auVar119,auVar100);
    auVar117 = vsubps_avx512vl(auVar117,auVar120);
    auVar117 = vaddps_avx512vl(auVar117,auVar117);
    auVar120 = vmulps_avx512vl(auVar100,auVar100);
    local_720 = vsubps_avx512vl(auVar118,auVar120);
    auVar94 = vsubps_avx512vl(local_720,auVar94);
    local_7a0 = vmulps_avx512vl(auVar117,auVar117);
    _local_7c0 = vmulps_avx512vl(auVar113,auVar96);
    auVar118 = vmulps_avx512vl(_local_7c0,auVar94);
    auVar118 = vsubps_avx512vl(local_7a0,auVar118);
    auVar76 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
    uVar62 = vcmpps_avx512vl(auVar118,auVar266,5);
    bVar52 = (byte)uVar62;
    if (bVar52 == 0) {
LAB_018d2d41:
      auVar235 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
      auVar264 = ZEXT3264(local_800);
      auVar265 = ZEXT3264(local_820);
    }
    else {
      auVar118 = vsqrtps_avx512vl(auVar118);
      local_7e0 = vaddps_avx512vl(auVar113,auVar113);
      _local_560 = vrcp14ps_avx512vl(local_7e0);
      auVar96._8_4_ = 0x3f800000;
      auVar96._0_8_ = 0x3f8000003f800000;
      auVar96._12_4_ = 0x3f800000;
      auVar96._16_4_ = 0x3f800000;
      auVar96._20_4_ = 0x3f800000;
      auVar96._24_4_ = 0x3f800000;
      auVar96._28_4_ = 0x3f800000;
      auVar96 = vfnmadd213ps_avx512vl(_local_560,local_7e0,auVar96);
      auVar96 = vfmadd132ps_avx512vl(auVar96,_local_560,_local_560);
      local_580 = vxorps_avx512vl(auVar117,auVar104);
      auVar104 = vsubps_avx512vl(local_580,auVar118);
      local_540 = vmulps_avx512vl(auVar104,auVar96);
      auVar104 = vsubps_avx512vl(auVar118,auVar117);
      local_5a0 = vmulps_avx512vl(auVar104,auVar96);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar118 = vblendmps_avx512vl(auVar104,local_540);
      auVar121._0_4_ =
           (uint)(bVar52 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar104._0_4_;
      bVar61 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar61 * auVar118._4_4_ | (uint)!bVar61 * auVar104._4_4_;
      bVar61 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar61 * auVar118._8_4_ | (uint)!bVar61 * auVar104._8_4_;
      bVar61 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar61 * auVar118._12_4_ | (uint)!bVar61 * auVar104._12_4_;
      bVar61 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar121._16_4_ = (uint)bVar61 * auVar118._16_4_ | (uint)!bVar61 * auVar104._16_4_;
      bVar61 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar121._20_4_ = (uint)bVar61 * auVar118._20_4_ | (uint)!bVar61 * auVar104._20_4_;
      bVar61 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar121._24_4_ = (uint)bVar61 * auVar118._24_4_ | (uint)!bVar61 * auVar104._24_4_;
      bVar61 = SUB81(uVar62 >> 7,0);
      auVar121._28_4_ = (uint)bVar61 * auVar118._28_4_ | (uint)!bVar61 * auVar104._28_4_;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar118 = vblendmps_avx512vl(auVar104,local_5a0);
      auVar122._0_4_ =
           (uint)(bVar52 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar104._0_4_;
      bVar61 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar61 * auVar118._4_4_ | (uint)!bVar61 * auVar104._4_4_;
      bVar61 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar61 * auVar118._8_4_ | (uint)!bVar61 * auVar104._8_4_;
      bVar61 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar61 * auVar118._12_4_ | (uint)!bVar61 * auVar104._12_4_;
      bVar61 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar61 * auVar118._16_4_ | (uint)!bVar61 * auVar104._16_4_;
      bVar61 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar61 * auVar118._20_4_ | (uint)!bVar61 * auVar104._20_4_;
      bVar61 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar61 * auVar118._24_4_ | (uint)!bVar61 * auVar104._24_4_;
      bVar61 = SUB81(uVar62 >> 7,0);
      auVar122._28_4_ = (uint)bVar61 * auVar118._28_4_ | (uint)!bVar61 * auVar104._28_4_;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar112,auVar104);
      local_5c0 = vmaxps_avx512vl(local_240,auVar104);
      auVar266._8_4_ = 0x36000000;
      auVar266._0_8_ = 0x3600000036000000;
      auVar266._12_4_ = 0x36000000;
      auVar266._16_4_ = 0x36000000;
      auVar266._20_4_ = 0x36000000;
      auVar266._24_4_ = 0x36000000;
      auVar266._28_4_ = 0x36000000;
      local_640 = vmulps_avx512vl(local_5c0,auVar266);
      vandps_avx512vl(auVar113,auVar104);
      uVar58 = vcmpps_avx512vl(local_640,local_640,1);
      uVar62 = uVar62 & uVar58;
      bVar59 = (byte)uVar62;
      if (bVar59 != 0) {
        uVar58 = vcmpps_avx512vl(auVar94,ZEXT1632(auVar76),2);
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar113 = vblendmps_avx512vl(auVar94,auVar112);
        bVar56 = (byte)uVar58;
        uVar63 = (uint)(bVar56 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar56 & 1) * local_640._0_4_;
        bVar61 = (bool)((byte)(uVar58 >> 1) & 1);
        uVar135 = (uint)bVar61 * auVar113._4_4_ | (uint)!bVar61 * local_640._4_4_;
        bVar61 = (bool)((byte)(uVar58 >> 2) & 1);
        uVar136 = (uint)bVar61 * auVar113._8_4_ | (uint)!bVar61 * local_640._8_4_;
        bVar61 = (bool)((byte)(uVar58 >> 3) & 1);
        uVar137 = (uint)bVar61 * auVar113._12_4_ | (uint)!bVar61 * local_640._12_4_;
        bVar61 = (bool)((byte)(uVar58 >> 4) & 1);
        uVar138 = (uint)bVar61 * auVar113._16_4_ | (uint)!bVar61 * local_640._16_4_;
        bVar61 = (bool)((byte)(uVar58 >> 5) & 1);
        uVar139 = (uint)bVar61 * auVar113._20_4_ | (uint)!bVar61 * local_640._20_4_;
        bVar61 = (bool)((byte)(uVar58 >> 6) & 1);
        uVar140 = (uint)bVar61 * auVar113._24_4_ | (uint)!bVar61 * local_640._24_4_;
        bVar61 = SUB81(uVar58 >> 7,0);
        uVar141 = (uint)bVar61 * auVar113._28_4_ | (uint)!bVar61 * local_640._28_4_;
        auVar121._0_4_ = (bVar59 & 1) * uVar63 | !(bool)(bVar59 & 1) * auVar121._0_4_;
        bVar61 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar121._4_4_ = bVar61 * uVar135 | !bVar61 * auVar121._4_4_;
        bVar61 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar121._8_4_ = bVar61 * uVar136 | !bVar61 * auVar121._8_4_;
        bVar61 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar121._12_4_ = bVar61 * uVar137 | !bVar61 * auVar121._12_4_;
        bVar61 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar121._16_4_ = bVar61 * uVar138 | !bVar61 * auVar121._16_4_;
        bVar61 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar121._20_4_ = bVar61 * uVar139 | !bVar61 * auVar121._20_4_;
        bVar61 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar121._24_4_ = bVar61 * uVar140 | !bVar61 * auVar121._24_4_;
        bVar61 = SUB81(uVar62 >> 7,0);
        auVar121._28_4_ = bVar61 * uVar141 | !bVar61 * auVar121._28_4_;
        auVar94 = vblendmps_avx512vl(auVar112,auVar94);
        bVar61 = (bool)((byte)(uVar58 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar58 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar58 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar58 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar58 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar58 >> 6) & 1);
        bVar14 = SUB81(uVar58 >> 7,0);
        auVar122._0_4_ =
             (uint)(bVar59 & 1) *
             ((uint)(bVar56 & 1) * auVar94._0_4_ | !(bool)(bVar56 & 1) * uVar63) |
             !(bool)(bVar59 & 1) * auVar122._0_4_;
        bVar8 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar122._4_4_ =
             (uint)bVar8 * ((uint)bVar61 * auVar94._4_4_ | !bVar61 * uVar135) |
             !bVar8 * auVar122._4_4_;
        bVar61 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar122._8_4_ =
             (uint)bVar61 * ((uint)bVar9 * auVar94._8_4_ | !bVar9 * uVar136) |
             !bVar61 * auVar122._8_4_;
        bVar61 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar122._12_4_ =
             (uint)bVar61 * ((uint)bVar10 * auVar94._12_4_ | !bVar10 * uVar137) |
             !bVar61 * auVar122._12_4_;
        bVar61 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar122._16_4_ =
             (uint)bVar61 * ((uint)bVar11 * auVar94._16_4_ | !bVar11 * uVar138) |
             !bVar61 * auVar122._16_4_;
        bVar61 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar122._20_4_ =
             (uint)bVar61 * ((uint)bVar12 * auVar94._20_4_ | !bVar12 * uVar139) |
             !bVar61 * auVar122._20_4_;
        bVar61 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar122._24_4_ =
             (uint)bVar61 * ((uint)bVar13 * auVar94._24_4_ | !bVar13 * uVar140) |
             !bVar61 * auVar122._24_4_;
        bVar61 = SUB81(uVar62 >> 7,0);
        auVar122._28_4_ =
             (uint)bVar61 * ((uint)bVar14 * auVar94._28_4_ | !bVar14 * uVar141) |
             !bVar61 * auVar122._28_4_;
        bVar52 = (~bVar59 | bVar56) & bVar52;
      }
      if ((bVar52 & 0x7f) == 0) {
        auVar235 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar264 = ZEXT3264(local_800);
        auVar265 = ZEXT3264(local_820);
      }
      else {
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar112 = vxorps_avx512vl(auVar111,auVar94);
        auVar113 = vxorps_avx512vl(auVar109,auVar94);
        auVar235 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
        auVar104 = vxorps_avx512vl(auVar110,auVar94);
        auVar76 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                                 ZEXT416((uint)local_620._0_4_));
        auVar109 = vbroadcastss_avx512vl(auVar76);
        auVar109 = vminps_avx512vl(auVar109,auVar122);
        auVar51._4_4_ = fStack_2dc;
        auVar51._0_4_ = local_2e0;
        auVar51._8_4_ = fStack_2d8;
        auVar51._12_4_ = fStack_2d4;
        auVar51._16_4_ = fStack_2d0;
        auVar51._20_4_ = fStack_2cc;
        auVar51._24_4_ = fStack_2c8;
        auVar51._28_4_ = fStack_2c4;
        auVar110 = vmaxps_avx512vl(auVar51,auVar121);
        auVar111 = vmulps_avx512vl(auVar125,auVar116);
        auVar111 = vfmadd213ps_avx512vl(auVar115,auVar124,auVar111);
        auVar76 = vfmadd213ps_fma(auVar114,auVar123,auVar111);
        auVar114 = vmulps_avx512vl(local_440,auVar125);
        auVar114 = vfmadd231ps_avx512vl(auVar114,local_420,auVar124);
        auVar114 = vfmadd231ps_avx512vl(auVar114,local_400,auVar123);
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar114,auVar111);
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar19 = vcmpps_avx512vl(auVar111,auVar115,1);
        auVar123 = vxorps_avx512vl(ZEXT1632(auVar76),auVar94);
        auVar124 = vrcp14ps_avx512vl(auVar114);
        auVar125 = vxorps_avx512vl(auVar114,auVar94);
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar118 = vfnmadd213ps_avx512vl(auVar124,auVar114,auVar116);
        auVar76 = vfmadd132ps_fma(auVar118,auVar124,auVar124);
        fVar243 = auVar76._0_4_ * auVar123._0_4_;
        fVar246 = auVar76._4_4_ * auVar123._4_4_;
        auVar35._4_4_ = fVar246;
        auVar35._0_4_ = fVar243;
        fVar247 = auVar76._8_4_ * auVar123._8_4_;
        auVar35._8_4_ = fVar247;
        fVar248 = auVar76._12_4_ * auVar123._12_4_;
        auVar35._12_4_ = fVar248;
        fVar218 = auVar123._16_4_ * 0.0;
        auVar35._16_4_ = fVar218;
        fVar219 = auVar123._20_4_ * 0.0;
        auVar35._20_4_ = fVar219;
        fVar220 = auVar123._24_4_ * 0.0;
        auVar35._24_4_ = fVar220;
        auVar35._28_4_ = auVar123._28_4_;
        uVar21 = vcmpps_avx512vl(auVar114,auVar125,1);
        bVar59 = (byte)uVar19 | (byte)uVar21;
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar96 = vblendmps_avx512vl(auVar35,auVar118);
        auVar126._0_4_ =
             (uint)(bVar59 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar124._0_4_;
        bVar61 = (bool)(bVar59 >> 1 & 1);
        auVar126._4_4_ = (uint)bVar61 * auVar96._4_4_ | (uint)!bVar61 * auVar124._4_4_;
        bVar61 = (bool)(bVar59 >> 2 & 1);
        auVar126._8_4_ = (uint)bVar61 * auVar96._8_4_ | (uint)!bVar61 * auVar124._8_4_;
        bVar61 = (bool)(bVar59 >> 3 & 1);
        auVar126._12_4_ = (uint)bVar61 * auVar96._12_4_ | (uint)!bVar61 * auVar124._12_4_;
        bVar61 = (bool)(bVar59 >> 4 & 1);
        auVar126._16_4_ = (uint)bVar61 * auVar96._16_4_ | (uint)!bVar61 * auVar124._16_4_;
        bVar61 = (bool)(bVar59 >> 5 & 1);
        auVar126._20_4_ = (uint)bVar61 * auVar96._20_4_ | (uint)!bVar61 * auVar124._20_4_;
        bVar61 = (bool)(bVar59 >> 6 & 1);
        auVar126._24_4_ = (uint)bVar61 * auVar96._24_4_ | (uint)!bVar61 * auVar124._24_4_;
        auVar126._28_4_ =
             (uint)(bVar59 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar124._28_4_;
        auVar124 = vmaxps_avx512vl(auVar110,auVar126);
        auVar257 = ZEXT3264(auVar124);
        uVar21 = vcmpps_avx512vl(auVar114,auVar125,6);
        bVar59 = (byte)uVar19 | (byte)uVar21;
        auVar127._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * (int)fVar243;
        bVar61 = (bool)(bVar59 >> 1 & 1);
        auVar127._4_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar246;
        bVar61 = (bool)(bVar59 >> 2 & 1);
        auVar127._8_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar247;
        bVar61 = (bool)(bVar59 >> 3 & 1);
        auVar127._12_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar248;
        bVar61 = (bool)(bVar59 >> 4 & 1);
        auVar127._16_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar218;
        bVar61 = (bool)(bVar59 >> 5 & 1);
        auVar127._20_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar219;
        bVar61 = (bool)(bVar59 >> 6 & 1);
        auVar127._24_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar220;
        auVar127._28_4_ =
             (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar123._28_4_;
        auVar114 = vminps_avx512vl(auVar109,auVar127);
        auVar76 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
        auVar106 = vsubps_avx512vl(ZEXT1632(auVar76),auVar106);
        auVar107 = vsubps_avx512vl(ZEXT1632(auVar76),auVar107);
        auVar109 = ZEXT1632(auVar76);
        auVar108 = vsubps_avx512vl(auVar109,auVar108);
        auVar108 = vmulps_avx512vl(auVar108,auVar112);
        auVar107 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar107);
        auVar106 = vfmadd231ps_avx512vl(auVar107,auVar113,auVar106);
        auVar112 = vmulps_avx512vl(local_440,auVar112);
        auVar112 = vfmadd231ps_avx512vl(auVar112,local_420,auVar104);
        auVar112 = vfmadd231ps_avx512vl(auVar112,local_400,auVar113);
        vandps_avx512vl(auVar112,auVar111);
        uVar19 = vcmpps_avx512vl(auVar112,auVar115,1);
        auVar113 = vxorps_avx512vl(auVar106,auVar94);
        auVar104 = vrcp14ps_avx512vl(auVar112);
        auVar94 = vxorps_avx512vl(auVar112,auVar94);
        auVar253 = ZEXT3264(auVar94);
        auVar106 = vfnmadd213ps_avx512vl(auVar104,auVar112,auVar116);
        auVar76 = vfmadd132ps_fma(auVar106,auVar104,auVar104);
        fVar243 = auVar76._0_4_ * auVar113._0_4_;
        fVar246 = auVar76._4_4_ * auVar113._4_4_;
        auVar36._4_4_ = fVar246;
        auVar36._0_4_ = fVar243;
        fVar247 = auVar76._8_4_ * auVar113._8_4_;
        auVar36._8_4_ = fVar247;
        fVar248 = auVar76._12_4_ * auVar113._12_4_;
        auVar36._12_4_ = fVar248;
        fVar218 = auVar113._16_4_ * 0.0;
        auVar36._16_4_ = fVar218;
        fVar219 = auVar113._20_4_ * 0.0;
        auVar36._20_4_ = fVar219;
        fVar220 = auVar113._24_4_ * 0.0;
        auVar36._24_4_ = fVar220;
        auVar36._28_4_ = auVar113._28_4_;
        uVar21 = vcmpps_avx512vl(auVar112,auVar94,1);
        bVar59 = (byte)uVar19 | (byte)uVar21;
        auVar106 = vblendmps_avx512vl(auVar36,auVar118);
        auVar128._0_4_ =
             (uint)(bVar59 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar104._0_4_;
        bVar61 = (bool)(bVar59 >> 1 & 1);
        auVar128._4_4_ = (uint)bVar61 * auVar106._4_4_ | (uint)!bVar61 * auVar104._4_4_;
        bVar61 = (bool)(bVar59 >> 2 & 1);
        auVar128._8_4_ = (uint)bVar61 * auVar106._8_4_ | (uint)!bVar61 * auVar104._8_4_;
        bVar61 = (bool)(bVar59 >> 3 & 1);
        auVar128._12_4_ = (uint)bVar61 * auVar106._12_4_ | (uint)!bVar61 * auVar104._12_4_;
        bVar61 = (bool)(bVar59 >> 4 & 1);
        auVar128._16_4_ = (uint)bVar61 * auVar106._16_4_ | (uint)!bVar61 * auVar104._16_4_;
        bVar61 = (bool)(bVar59 >> 5 & 1);
        auVar128._20_4_ = (uint)bVar61 * auVar106._20_4_ | (uint)!bVar61 * auVar104._20_4_;
        bVar61 = (bool)(bVar59 >> 6 & 1);
        auVar128._24_4_ = (uint)bVar61 * auVar106._24_4_ | (uint)!bVar61 * auVar104._24_4_;
        auVar128._28_4_ =
             (uint)(bVar59 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar104._28_4_;
        local_840 = vmaxps_avx(auVar124,auVar128);
        uVar21 = vcmpps_avx512vl(auVar112,auVar94,6);
        bVar59 = (byte)uVar19 | (byte)uVar21;
        auVar129._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * (int)fVar243;
        bVar61 = (bool)(bVar59 >> 1 & 1);
        auVar129._4_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar246;
        bVar61 = (bool)(bVar59 >> 2 & 1);
        auVar129._8_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar247;
        bVar61 = (bool)(bVar59 >> 3 & 1);
        auVar129._12_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar248;
        bVar61 = (bool)(bVar59 >> 4 & 1);
        auVar129._16_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar218;
        bVar61 = (bool)(bVar59 >> 5 & 1);
        auVar129._20_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar219;
        bVar61 = (bool)(bVar59 >> 6 & 1);
        auVar129._24_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar220;
        auVar129._28_4_ =
             (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar113._28_4_;
        local_320 = vminps_avx(auVar114,auVar129);
        auVar249 = ZEXT3264(local_320);
        uVar19 = vcmpps_avx512vl(local_840,local_320,2);
        bVar52 = bVar52 & 0x7f & (byte)uVar19;
        if (bVar52 == 0) goto LAB_018d2d41;
        auVar94 = vmaxps_avx512vl(auVar109,auVar97);
        auVar97 = vfmadd213ps_avx512vl(local_540,auVar119,auVar100);
        fVar243 = auVar99._0_4_;
        fVar246 = auVar99._4_4_;
        auVar37._4_4_ = fVar246 * auVar97._4_4_;
        auVar37._0_4_ = fVar243 * auVar97._0_4_;
        fVar247 = auVar99._8_4_;
        auVar37._8_4_ = fVar247 * auVar97._8_4_;
        fVar248 = auVar99._12_4_;
        auVar37._12_4_ = fVar248 * auVar97._12_4_;
        fVar218 = auVar99._16_4_;
        auVar37._16_4_ = fVar218 * auVar97._16_4_;
        fVar219 = auVar99._20_4_;
        auVar37._20_4_ = fVar219 * auVar97._20_4_;
        fVar220 = auVar99._24_4_;
        auVar37._24_4_ = fVar220 * auVar97._24_4_;
        auVar37._28_4_ = auVar97._28_4_;
        auVar97 = vfmadd213ps_avx512vl(local_5a0,auVar119,auVar100);
        auVar38._4_4_ = fVar246 * auVar97._4_4_;
        auVar38._0_4_ = fVar243 * auVar97._0_4_;
        auVar38._8_4_ = fVar247 * auVar97._8_4_;
        auVar38._12_4_ = fVar248 * auVar97._12_4_;
        auVar38._16_4_ = fVar218 * auVar97._16_4_;
        auVar38._20_4_ = fVar219 * auVar97._20_4_;
        auVar38._24_4_ = fVar220 * auVar97._24_4_;
        auVar38._28_4_ = auVar97._28_4_;
        auVar97 = vminps_avx512vl(auVar37,auVar116);
        auVar46 = ZEXT812(0);
        auVar112 = ZEXT1232(auVar46) << 0x20;
        auVar97 = vmaxps_avx(auVar97,ZEXT1232(auVar46) << 0x20);
        auVar113 = vminps_avx512vl(auVar38,auVar116);
        auVar39._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
        auVar39._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
        auVar39._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
        auVar39._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
        auVar39._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
        auVar39._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
        auVar39._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
        auVar39._28_4_ = auVar97._28_4_ + 7.0;
        local_1e0 = vfmadd213ps_avx512vl(auVar39,local_700,auVar228);
        auVar97 = vmaxps_avx(auVar113,ZEXT1232(auVar46) << 0x20);
        auVar40._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
        auVar40._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
        auVar40._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
        auVar40._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
        auVar40._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
        auVar40._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
        auVar40._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
        auVar40._28_4_ = auVar97._28_4_ + 7.0;
        local_200 = vfmadd213ps_avx512vl(auVar40,local_700,auVar228);
        auVar41._4_4_ = auVar94._4_4_ * auVar94._4_4_;
        auVar41._0_4_ = auVar94._0_4_ * auVar94._0_4_;
        auVar41._8_4_ = auVar94._8_4_ * auVar94._8_4_;
        auVar41._12_4_ = auVar94._12_4_ * auVar94._12_4_;
        auVar41._16_4_ = auVar94._16_4_ * auVar94._16_4_;
        auVar41._20_4_ = auVar94._20_4_ * auVar94._20_4_;
        auVar41._24_4_ = auVar94._24_4_ * auVar94._24_4_;
        auVar41._28_4_ = auVar94._28_4_;
        auVar97 = vsubps_avx(local_720,auVar41);
        auVar42._4_4_ = auVar97._4_4_ * (float)local_7c0._4_4_;
        auVar42._0_4_ = auVar97._0_4_ * (float)local_7c0._0_4_;
        auVar42._8_4_ = auVar97._8_4_ * fStack_7b8;
        auVar42._12_4_ = auVar97._12_4_ * fStack_7b4;
        auVar42._16_4_ = auVar97._16_4_ * fStack_7b0;
        auVar42._20_4_ = auVar97._20_4_ * fStack_7ac;
        auVar42._24_4_ = auVar97._24_4_ * fStack_7a8;
        auVar42._28_4_ = auVar94._28_4_;
        auVar94 = vsubps_avx(local_7a0,auVar42);
        uVar19 = vcmpps_avx512vl(auVar94,ZEXT1232(auVar46) << 0x20,5);
        bVar59 = (byte)uVar19;
        auVar264 = ZEXT3264(local_800);
        auVar265 = ZEXT3264(local_820);
        if (bVar59 == 0) {
          bVar59 = 0;
          auVar95 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar184 = ZEXT864(0) << 0x20;
          auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar113 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar250 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar130._8_4_ = 0x7f800000;
          auVar130._0_8_ = 0x7f8000007f800000;
          auVar130._12_4_ = 0x7f800000;
          auVar130._16_4_ = 0x7f800000;
          auVar130._20_4_ = 0x7f800000;
          auVar130._24_4_ = 0x7f800000;
          auVar130._28_4_ = 0x7f800000;
          auVar131._8_4_ = 0xff800000;
          auVar131._0_8_ = 0xff800000ff800000;
          auVar131._12_4_ = 0xff800000;
          auVar131._16_4_ = 0xff800000;
          auVar131._20_4_ = 0xff800000;
          auVar131._24_4_ = 0xff800000;
          auVar131._28_4_ = 0xff800000;
        }
        else {
          auVar80 = vxorps_avx512vl(auVar145,auVar145);
          uVar62 = vcmpps_avx512vl(auVar94,auVar109,5);
          auVar94 = vsqrtps_avx(auVar94);
          auVar112 = vfnmadd213ps_avx512vl(local_7e0,_local_560,auVar116);
          auVar76 = vfmadd132ps_fma(auVar112,_local_560,_local_560);
          auVar112 = vsubps_avx(local_580,auVar94);
          auVar43._4_4_ = auVar76._4_4_ * auVar112._4_4_;
          auVar43._0_4_ = auVar76._0_4_ * auVar112._0_4_;
          auVar43._8_4_ = auVar76._8_4_ * auVar112._8_4_;
          auVar43._12_4_ = auVar76._12_4_ * auVar112._12_4_;
          auVar43._16_4_ = auVar112._16_4_ * 0.0;
          auVar43._20_4_ = auVar112._20_4_ * 0.0;
          auVar43._24_4_ = auVar112._24_4_ * 0.0;
          auVar43._28_4_ = 0x3e000000;
          auVar94 = vsubps_avx512vl(auVar94,auVar117);
          auVar44._4_4_ = auVar76._4_4_ * auVar94._4_4_;
          auVar44._0_4_ = auVar76._0_4_ * auVar94._0_4_;
          auVar44._8_4_ = auVar76._8_4_ * auVar94._8_4_;
          auVar44._12_4_ = auVar76._12_4_ * auVar94._12_4_;
          auVar44._16_4_ = auVar94._16_4_ * 0.0;
          auVar44._20_4_ = auVar94._20_4_ * 0.0;
          auVar44._24_4_ = auVar94._24_4_ * 0.0;
          auVar44._28_4_ = uVar165;
          auVar94 = vfmadd213ps_avx512vl(auVar119,auVar43,auVar100);
          auVar251._0_4_ = fVar243 * auVar94._0_4_;
          auVar251._4_4_ = fVar246 * auVar94._4_4_;
          auVar251._8_4_ = fVar247 * auVar94._8_4_;
          auVar251._12_4_ = fVar248 * auVar94._12_4_;
          auVar251._16_4_ = fVar218 * auVar94._16_4_;
          auVar251._20_4_ = fVar219 * auVar94._20_4_;
          auVar251._24_4_ = fVar220 * auVar94._24_4_;
          auVar251._28_4_ = 0;
          auVar94 = vmulps_avx512vl(local_400,auVar43);
          auVar112 = vmulps_avx512vl(local_420,auVar43);
          auVar114 = vmulps_avx512vl(local_440,auVar43);
          auVar113 = vfmadd213ps_avx512vl(auVar95,auVar251,auVar101);
          auVar94 = vsubps_avx512vl(auVar94,auVar113);
          auVar113 = vfmadd213ps_avx512vl(auVar98,auVar251,auVar102);
          auVar113 = vsubps_avx512vl(auVar112,auVar113);
          auVar76 = vfmadd213ps_fma(auVar251,auVar105,auVar103);
          auVar112 = vsubps_avx(auVar114,ZEXT1632(auVar76));
          auVar250 = auVar112._0_28_;
          auVar100 = vfmadd213ps_avx512vl(auVar119,auVar44,auVar100);
          auVar99 = vmulps_avx512vl(auVar99,auVar100);
          auVar100 = vmulps_avx512vl(local_400,auVar44);
          auVar114 = vmulps_avx512vl(local_420,auVar44);
          auVar104 = vmulps_avx512vl(local_440,auVar44);
          auVar76 = vfmadd213ps_fma(auVar95,auVar99,auVar101);
          auVar112 = vsubps_avx(auVar100,ZEXT1632(auVar76));
          auVar76 = vfmadd213ps_fma(auVar98,auVar99,auVar102);
          auVar95 = vsubps_avx512vl(auVar114,ZEXT1632(auVar76));
          auVar76 = vfmadd213ps_fma(auVar105,auVar99,auVar103);
          auVar98 = vsubps_avx512vl(auVar104,ZEXT1632(auVar76));
          auVar184 = ZEXT3264(auVar98);
          auVar152._8_4_ = 0x7f800000;
          auVar152._0_8_ = 0x7f8000007f800000;
          auVar152._12_4_ = 0x7f800000;
          auVar152._16_4_ = 0x7f800000;
          auVar152._20_4_ = 0x7f800000;
          auVar152._24_4_ = 0x7f800000;
          auVar152._28_4_ = 0x7f800000;
          auVar98 = vblendmps_avx512vl(auVar152,auVar43);
          bVar61 = (bool)((byte)uVar62 & 1);
          auVar130._0_4_ = (uint)bVar61 * auVar98._0_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar61 * auVar98._4_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar61 * auVar98._8_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar61 * auVar98._12_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar130._16_4_ = (uint)bVar61 * auVar98._16_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar130._20_4_ = (uint)bVar61 * auVar98._20_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar130._24_4_ = (uint)bVar61 * auVar98._24_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = SUB81(uVar62 >> 7,0);
          auVar130._28_4_ = (uint)bVar61 * auVar98._28_4_ | (uint)!bVar61 * 0x7f800000;
          auVar204._8_4_ = 0xff800000;
          auVar204._0_8_ = 0xff800000ff800000;
          auVar204._12_4_ = 0xff800000;
          auVar204._16_4_ = 0xff800000;
          auVar204._20_4_ = 0xff800000;
          auVar204._24_4_ = 0xff800000;
          auVar204._28_4_ = 0xff800000;
          auVar98 = vblendmps_avx512vl(auVar204,auVar44);
          bVar61 = (bool)((byte)uVar62 & 1);
          auVar131._0_4_ = (uint)bVar61 * auVar98._0_4_ | (uint)!bVar61 * -0x800000;
          bVar61 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar61 * auVar98._4_4_ | (uint)!bVar61 * -0x800000;
          bVar61 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar61 * auVar98._8_4_ | (uint)!bVar61 * -0x800000;
          bVar61 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar131._12_4_ = (uint)bVar61 * auVar98._12_4_ | (uint)!bVar61 * -0x800000;
          bVar61 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar131._16_4_ = (uint)bVar61 * auVar98._16_4_ | (uint)!bVar61 * -0x800000;
          bVar61 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar131._20_4_ = (uint)bVar61 * auVar98._20_4_ | (uint)!bVar61 * -0x800000;
          bVar61 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar131._24_4_ = (uint)bVar61 * auVar98._24_4_ | (uint)!bVar61 * -0x800000;
          bVar61 = SUB81(uVar62 >> 7,0);
          auVar131._28_4_ = (uint)bVar61 * auVar98._28_4_ | (uint)!bVar61 * -0x800000;
          auVar30._8_4_ = 0x36000000;
          auVar30._0_8_ = 0x3600000036000000;
          auVar30._12_4_ = 0x36000000;
          auVar30._16_4_ = 0x36000000;
          auVar30._20_4_ = 0x36000000;
          auVar30._24_4_ = 0x36000000;
          auVar30._28_4_ = 0x36000000;
          auVar98 = vmulps_avx512vl(local_5c0,auVar30);
          uVar58 = vcmpps_avx512vl(auVar98,local_640,0xe);
          uVar62 = uVar62 & uVar58;
          bVar56 = (byte)uVar62;
          if (bVar56 != 0) {
            uVar58 = vcmpps_avx512vl(auVar97,ZEXT1632(auVar80),2);
            auVar244._8_4_ = 0x7f800000;
            auVar244._0_8_ = 0x7f8000007f800000;
            auVar244._12_4_ = 0x7f800000;
            auVar244._16_4_ = 0x7f800000;
            auVar244._20_4_ = 0x7f800000;
            auVar244._24_4_ = 0x7f800000;
            auVar244._28_4_ = 0x7f800000;
            auVar256._8_4_ = 0xff800000;
            auVar256._0_8_ = 0xff800000ff800000;
            auVar256._12_4_ = 0xff800000;
            auVar256._16_4_ = 0xff800000;
            auVar256._20_4_ = 0xff800000;
            auVar256._24_4_ = 0xff800000;
            auVar256._28_4_ = 0xff800000;
            auVar97 = vblendmps_avx512vl(auVar244,auVar256);
            bVar53 = (byte)uVar58;
            uVar63 = (uint)(bVar53 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar98._0_4_;
            bVar61 = (bool)((byte)(uVar58 >> 1) & 1);
            uVar135 = (uint)bVar61 * auVar97._4_4_ | (uint)!bVar61 * auVar98._4_4_;
            bVar61 = (bool)((byte)(uVar58 >> 2) & 1);
            uVar136 = (uint)bVar61 * auVar97._8_4_ | (uint)!bVar61 * auVar98._8_4_;
            bVar61 = (bool)((byte)(uVar58 >> 3) & 1);
            uVar137 = (uint)bVar61 * auVar97._12_4_ | (uint)!bVar61 * auVar98._12_4_;
            bVar61 = (bool)((byte)(uVar58 >> 4) & 1);
            uVar138 = (uint)bVar61 * auVar97._16_4_ | (uint)!bVar61 * auVar98._16_4_;
            bVar61 = (bool)((byte)(uVar58 >> 5) & 1);
            uVar139 = (uint)bVar61 * auVar97._20_4_ | (uint)!bVar61 * auVar98._20_4_;
            bVar61 = (bool)((byte)(uVar58 >> 6) & 1);
            uVar140 = (uint)bVar61 * auVar97._24_4_ | (uint)!bVar61 * auVar98._24_4_;
            bVar61 = SUB81(uVar58 >> 7,0);
            uVar141 = (uint)bVar61 * auVar97._28_4_ | (uint)!bVar61 * auVar98._28_4_;
            auVar130._0_4_ = (bVar56 & 1) * uVar63 | !(bool)(bVar56 & 1) * auVar130._0_4_;
            bVar61 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar130._4_4_ = bVar61 * uVar135 | !bVar61 * auVar130._4_4_;
            bVar61 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar130._8_4_ = bVar61 * uVar136 | !bVar61 * auVar130._8_4_;
            bVar61 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar130._12_4_ = bVar61 * uVar137 | !bVar61 * auVar130._12_4_;
            bVar61 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar130._16_4_ = bVar61 * uVar138 | !bVar61 * auVar130._16_4_;
            bVar61 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar130._20_4_ = bVar61 * uVar139 | !bVar61 * auVar130._20_4_;
            bVar61 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar130._24_4_ = bVar61 * uVar140 | !bVar61 * auVar130._24_4_;
            bVar61 = SUB81(uVar62 >> 7,0);
            auVar130._28_4_ = bVar61 * uVar141 | !bVar61 * auVar130._28_4_;
            auVar97 = vblendmps_avx512vl(auVar256,auVar244);
            bVar61 = (bool)((byte)(uVar58 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar58 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar58 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar58 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar58 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar58 >> 6) & 1);
            bVar14 = SUB81(uVar58 >> 7,0);
            auVar131._0_4_ =
                 (uint)(bVar56 & 1) *
                 ((uint)(bVar53 & 1) * auVar97._0_4_ | !(bool)(bVar53 & 1) * uVar63) |
                 !(bool)(bVar56 & 1) * auVar131._0_4_;
            bVar8 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar131._4_4_ =
                 (uint)bVar8 * ((uint)bVar61 * auVar97._4_4_ | !bVar61 * uVar135) |
                 !bVar8 * auVar131._4_4_;
            bVar61 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar131._8_4_ =
                 (uint)bVar61 * ((uint)bVar9 * auVar97._8_4_ | !bVar9 * uVar136) |
                 !bVar61 * auVar131._8_4_;
            bVar61 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar131._12_4_ =
                 (uint)bVar61 * ((uint)bVar10 * auVar97._12_4_ | !bVar10 * uVar137) |
                 !bVar61 * auVar131._12_4_;
            bVar61 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar131._16_4_ =
                 (uint)bVar61 * ((uint)bVar11 * auVar97._16_4_ | !bVar11 * uVar138) |
                 !bVar61 * auVar131._16_4_;
            bVar61 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar131._20_4_ =
                 (uint)bVar61 * ((uint)bVar12 * auVar97._20_4_ | !bVar12 * uVar139) |
                 !bVar61 * auVar131._20_4_;
            bVar61 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar131._24_4_ =
                 (uint)bVar61 * ((uint)bVar13 * auVar97._24_4_ | !bVar13 * uVar140) |
                 !bVar61 * auVar131._24_4_;
            bVar61 = SUB81(uVar62 >> 7,0);
            auVar131._28_4_ =
                 (uint)bVar61 * ((uint)bVar14 * auVar97._28_4_ | !bVar14 * uVar141) |
                 !bVar61 * auVar131._28_4_;
            bVar59 = (~bVar56 | bVar53) & bVar59;
          }
        }
        auVar242._0_4_ = local_440._0_4_ * auVar184._0_4_;
        auVar242._4_4_ = local_440._4_4_ * auVar184._4_4_;
        auVar242._8_4_ = local_440._8_4_ * auVar184._8_4_;
        auVar242._12_4_ = local_440._12_4_ * auVar184._12_4_;
        auVar242._16_4_ = local_440._16_4_ * auVar184._16_4_;
        auVar242._20_4_ = local_440._20_4_ * auVar184._20_4_;
        auVar242._28_36_ = auVar184._28_36_;
        auVar242._24_4_ = local_440._24_4_ * auVar184._24_4_;
        auVar257 = ZEXT3264(local_420);
        auVar76 = vfmadd231ps_fma(auVar242._0_32_,local_420,auVar95);
        auVar245 = ZEXT3264(local_400);
        auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_400,auVar112);
        auVar241._8_4_ = 0x7fffffff;
        auVar241._0_8_ = 0x7fffffff7fffffff;
        auVar241._12_4_ = 0x7fffffff;
        auVar241._16_4_ = 0x7fffffff;
        auVar241._20_4_ = 0x7fffffff;
        auVar241._24_4_ = 0x7fffffff;
        auVar241._28_4_ = 0x7fffffff;
        auVar242 = ZEXT3264(auVar241);
        auVar97 = vandps_avx(ZEXT1632(auVar76),auVar241);
        auVar253 = ZEXT3264(local_840);
        _local_1c0 = local_840;
        auVar240._8_4_ = 0x3e99999a;
        auVar240._0_8_ = 0x3e99999a3e99999a;
        auVar240._12_4_ = 0x3e99999a;
        auVar240._16_4_ = 0x3e99999a;
        auVar240._20_4_ = 0x3e99999a;
        auVar240._24_4_ = 0x3e99999a;
        auVar240._28_4_ = 0x3e99999a;
        uVar19 = vcmpps_avx512vl(auVar97,auVar240,1);
        _local_340 = vmaxps_avx(local_840,auVar131);
        auVar97 = vminps_avx(local_320,auVar130);
        uVar21 = vcmpps_avx512vl(local_840,auVar97,2);
        bVar56 = (byte)uVar21 & bVar52;
        _local_3c0 = _local_340;
        uVar20 = vcmpps_avx512vl(_local_340,local_320,2);
        if ((bVar52 & ((byte)uVar20 | (byte)uVar21)) == 0) {
          auVar235 = ZEXT3264(auVar241);
        }
        else {
          local_850 = (uint)(byte)((byte)uVar19 | ~bVar59);
          auVar45._4_4_ = local_440._4_4_ * auVar250._4_4_;
          auVar45._0_4_ = local_440._0_4_ * auVar250._0_4_;
          auVar45._8_4_ = local_440._8_4_ * auVar250._8_4_;
          auVar45._12_4_ = local_440._12_4_ * auVar250._12_4_;
          auVar45._16_4_ = local_440._16_4_ * auVar250._16_4_;
          auVar45._20_4_ = local_440._20_4_ * auVar250._20_4_;
          auVar45._24_4_ = local_440._24_4_ * auVar250._24_4_;
          auVar45._28_4_ = auVar97._28_4_;
          auVar76 = vfmadd213ps_fma(auVar113,local_420,auVar45);
          auVar76 = vfmadd213ps_fma(auVar94,local_400,ZEXT1632(auVar76));
          auVar97 = vandps_avx(ZEXT1632(auVar76),auVar241);
          uVar19 = vcmpps_avx512vl(auVar97,auVar240,1);
          bVar59 = (byte)uVar19 | ~bVar59;
          auVar153._8_4_ = 2;
          auVar153._0_8_ = 0x200000002;
          auVar153._12_4_ = 2;
          auVar153._16_4_ = 2;
          auVar153._20_4_ = 2;
          auVar153._24_4_ = 2;
          auVar153._28_4_ = 2;
          auVar31._8_4_ = 3;
          auVar31._0_8_ = 0x300000003;
          auVar31._12_4_ = 3;
          auVar31._16_4_ = 3;
          auVar31._20_4_ = 3;
          auVar31._24_4_ = 3;
          auVar31._28_4_ = 3;
          auVar97 = vpblendmd_avx512vl(auVar153,auVar31);
          local_300._0_4_ = (uint)(bVar59 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar59 & 1) * 2;
          bVar61 = (bool)(bVar59 >> 1 & 1);
          local_300._4_4_ = (uint)bVar61 * auVar97._4_4_ | (uint)!bVar61 * 2;
          bVar61 = (bool)(bVar59 >> 2 & 1);
          local_300._8_4_ = (uint)bVar61 * auVar97._8_4_ | (uint)!bVar61 * 2;
          bVar61 = (bool)(bVar59 >> 3 & 1);
          local_300._12_4_ = (uint)bVar61 * auVar97._12_4_ | (uint)!bVar61 * 2;
          bVar61 = (bool)(bVar59 >> 4 & 1);
          local_300._16_4_ = (uint)bVar61 * auVar97._16_4_ | (uint)!bVar61 * 2;
          bVar61 = (bool)(bVar59 >> 5 & 1);
          local_300._20_4_ = (uint)bVar61 * auVar97._20_4_ | (uint)!bVar61 * 2;
          bVar61 = (bool)(bVar59 >> 6 & 1);
          local_300._24_4_ = (uint)bVar61 * auVar97._24_4_ | (uint)!bVar61 * 2;
          local_300._28_4_ = (uint)(bVar59 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar59 >> 7) * 2;
          local_360 = vpbroadcastd_avx512vl();
          uVar19 = vpcmpd_avx512vl(local_360,local_300,5);
          local_84c = (uint)bVar56;
          local_3a0 = local_840._0_4_ + (float)local_3e0._0_4_;
          fStack_39c = local_840._4_4_ + (float)local_3e0._4_4_;
          fStack_398 = local_840._8_4_ + fStack_3d8;
          fStack_394 = local_840._12_4_ + fStack_3d4;
          fStack_390 = local_840._16_4_ + fStack_3d0;
          fStack_38c = local_840._20_4_ + fStack_3cc;
          fStack_388 = local_840._24_4_ + fStack_3c8;
          fStack_384 = local_840._28_4_ + fStack_3c4;
          auVar184 = ZEXT3264(local_840);
          for (bVar56 = (byte)uVar19 & bVar56; bVar56 != 0; bVar56 = ~bVar59 & bVar56 & (byte)uVar19
              ) {
            auVar154._8_4_ = 0x7f800000;
            auVar154._0_8_ = 0x7f8000007f800000;
            auVar154._12_4_ = 0x7f800000;
            auVar154._16_4_ = 0x7f800000;
            auVar154._20_4_ = 0x7f800000;
            auVar154._24_4_ = 0x7f800000;
            auVar154._28_4_ = 0x7f800000;
            auVar97 = vblendmps_avx512vl(auVar154,auVar184._0_32_);
            auVar132._0_4_ =
                 (uint)(bVar56 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar56 & 1) * 0x7f800000;
            bVar61 = (bool)(bVar56 >> 1 & 1);
            auVar132._4_4_ = (uint)bVar61 * auVar97._4_4_ | (uint)!bVar61 * 0x7f800000;
            bVar61 = (bool)(bVar56 >> 2 & 1);
            auVar132._8_4_ = (uint)bVar61 * auVar97._8_4_ | (uint)!bVar61 * 0x7f800000;
            bVar61 = (bool)(bVar56 >> 3 & 1);
            auVar132._12_4_ = (uint)bVar61 * auVar97._12_4_ | (uint)!bVar61 * 0x7f800000;
            bVar61 = (bool)(bVar56 >> 4 & 1);
            auVar132._16_4_ = (uint)bVar61 * auVar97._16_4_ | (uint)!bVar61 * 0x7f800000;
            bVar61 = (bool)(bVar56 >> 5 & 1);
            auVar132._20_4_ = (uint)bVar61 * auVar97._20_4_ | (uint)!bVar61 * 0x7f800000;
            auVar132._24_4_ =
                 (uint)(bVar56 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar56 >> 6) * 0x7f800000;
            auVar132._28_4_ = 0x7f800000;
            auVar97 = vshufps_avx(auVar132,auVar132,0xb1);
            auVar97 = vminps_avx(auVar132,auVar97);
            auVar94 = vshufpd_avx(auVar97,auVar97,5);
            auVar97 = vminps_avx(auVar97,auVar94);
            auVar94 = vpermpd_avx2(auVar97,0x4e);
            auVar97 = vminps_avx(auVar97,auVar94);
            uVar19 = vcmpps_avx512vl(auVar132,auVar97,0);
            bVar53 = (byte)uVar19 & bVar56;
            bVar59 = bVar56;
            if (bVar53 != 0) {
              bVar59 = bVar53;
            }
            iVar22 = 0;
            for (uVar63 = (uint)bVar59; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            bVar59 = '\x01' << ((byte)iVar22 & 0x1f);
            fVar243 = *(float *)(local_1e0 + (uint)(iVar22 << 2));
            auVar245 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar22 << 2)));
            fVar246 = local_848;
            if ((float)local_6e0._0_4_ < 0.0) {
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar22 << 2)));
              auVar242 = ZEXT1664(auVar242._0_16_);
              auVar249 = ZEXT1664(auVar249._0_16_);
              auVar253 = ZEXT1664(auVar253._0_16_);
              auVar257 = ZEXT1664(auVar257._0_16_);
              fVar246 = sqrtf((float)local_6e0._0_4_);
              auVar245 = ZEXT1664(local_7a0._0_16_);
              auVar265 = ZEXT3264(local_820);
              auVar264 = ZEXT3264(local_800);
            }
            uVar62 = (ulong)bVar59;
            auVar80 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar76 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar77 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar81 = vminps_avx(auVar80,auVar77);
            auVar80 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar77 = vmaxps_avx(auVar76,auVar80);
            auVar211._8_4_ = 0x7fffffff;
            auVar211._0_8_ = 0x7fffffff7fffffff;
            auVar211._12_4_ = 0x7fffffff;
            auVar76 = vandps_avx(auVar81,auVar211);
            auVar80 = vandps_avx(auVar77,auVar211);
            auVar76 = vmaxps_avx(auVar76,auVar80);
            auVar80 = vmovshdup_avx(auVar76);
            auVar80 = vmaxss_avx(auVar80,auVar76);
            auVar76 = vshufpd_avx(auVar76,auVar76,1);
            auVar76 = vmaxss_avx(auVar76,auVar80);
            fVar247 = auVar76._0_4_ * 1.9073486e-06;
            local_770._0_4_ = fVar246 * 1.9073486e-06;
            local_610 = vshufps_avx(auVar77,auVar77,0xff);
            uVar58 = 0;
            while( true ) {
              auVar76 = ZEXT416((uint)fVar243);
              bVar53 = (byte)uVar62;
              if (uVar58 == 5) break;
              local_7a0._0_16_ = auVar245._0_16_;
              uVar165 = auVar245._0_4_;
              auVar146._4_4_ = uVar165;
              auVar146._0_4_ = uVar165;
              auVar146._8_4_ = uVar165;
              auVar146._12_4_ = uVar165;
              auVar80 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_6d0);
              fVar230 = 1.0 - fVar243;
              fVar218 = fVar230 * fVar230 * fVar230;
              fVar246 = fVar243 * fVar243;
              fVar229 = fVar243 * fVar246;
              auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar218),
                                        ZEXT416((uint)fVar229));
              fVar248 = fVar243 * fVar230;
              auVar82 = ZEXT416((uint)fVar230);
              auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * fVar248 * 6.0)),
                                       ZEXT416((uint)(fVar248 * fVar230)),
                                       SUB6416(ZEXT464(0x41400000),0));
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar229),
                                        ZEXT416((uint)fVar218));
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * fVar230 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar243 * fVar248)));
              fVar218 = fVar218 * 0.16666667;
              fVar219 = (auVar77._0_4_ + auVar2._0_4_) * 0.16666667;
              fVar220 = (auVar81._0_4_ + auVar83._0_4_) * 0.16666667;
              fVar229 = fVar229 * 0.16666667;
              auVar188._0_4_ = fVar229 * (float)local_6c0._0_4_;
              auVar188._4_4_ = fVar229 * (float)local_6c0._4_4_;
              auVar188._8_4_ = fVar229 * fStack_6b8;
              auVar188._12_4_ = fVar229 * fStack_6b4;
              auVar224._4_4_ = fVar220;
              auVar224._0_4_ = fVar220;
              auVar224._8_4_ = fVar220;
              auVar224._12_4_ = fVar220;
              auVar77 = vfmadd132ps_fma(auVar224,auVar188,local_680._0_16_);
              auVar189._4_4_ = fVar219;
              auVar189._0_4_ = fVar219;
              auVar189._8_4_ = fVar219;
              auVar189._12_4_ = fVar219;
              auVar77 = vfmadd132ps_fma(auVar189,auVar77,local_6a0._0_16_);
              auVar169._4_4_ = fVar218;
              auVar169._0_4_ = fVar218;
              auVar169._8_4_ = fVar218;
              auVar169._12_4_ = fVar218;
              auVar77 = vfmadd132ps_fma(auVar169,auVar77,local_660._0_16_);
              local_540._0_16_ = auVar77;
              auVar80 = vsubps_avx(auVar80,auVar77);
              local_700._0_16_ = auVar80;
              auVar80 = vdpps_avx(auVar80,auVar80,0x7f);
              local_720._0_16_ = auVar80;
              if (auVar80._0_4_ < 0.0) {
                local_7c0._0_4_ = fVar246;
                local_7e0._0_4_ = fVar248;
                auVar249._0_4_ = sqrtf(auVar80._0_4_);
                auVar249._4_60_ = extraout_var;
                auVar80 = auVar249._0_16_;
                uVar62 = extraout_RAX;
                fVar248 = (float)local_7e0._0_4_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar80,auVar80);
                local_7c0._0_4_ = fVar246;
              }
              local_560._4_4_ = fVar230;
              local_560._0_4_ = fVar230;
              fStack_558 = fVar230;
              fStack_554 = fVar230;
              auVar81 = vfnmsub213ss_fma(auVar76,auVar76,ZEXT416((uint)(fVar248 * 4.0)));
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * 4.0)),auVar82,auVar82);
              fVar246 = fVar230 * -fVar230 * 0.5;
              fVar248 = auVar81._0_4_ * 0.5;
              fVar218 = auVar77._0_4_ * 0.5;
              local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
              auVar212._0_4_ = (float)local_7c0._0_4_ * (float)local_6c0._0_4_;
              auVar212._4_4_ = (float)local_7c0._0_4_ * (float)local_6c0._4_4_;
              auVar212._8_4_ = (float)local_7c0._0_4_ * fStack_6b8;
              auVar212._12_4_ = (float)local_7c0._0_4_ * fStack_6b4;
              auVar170._4_4_ = fVar218;
              auVar170._0_4_ = fVar218;
              auVar170._8_4_ = fVar218;
              auVar170._12_4_ = fVar218;
              auVar77 = vfmadd132ps_fma(auVar170,auVar212,local_680._0_16_);
              auVar190._4_4_ = fVar248;
              auVar190._0_4_ = fVar248;
              auVar190._8_4_ = fVar248;
              auVar190._12_4_ = fVar248;
              auVar77 = vfmadd132ps_fma(auVar190,auVar77,local_6a0._0_16_);
              auVar254._4_4_ = fVar246;
              auVar254._0_4_ = fVar246;
              auVar254._8_4_ = fVar246;
              auVar254._12_4_ = fVar246;
              _local_7c0 = vfmadd132ps_fma(auVar254,auVar77,local_660._0_16_);
              local_580._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
              auVar47._12_4_ = 0;
              auVar47._0_12_ = ZEXT812(0);
              fVar246 = local_580._0_4_;
              local_640._0_16_ = vrsqrt14ss_avx512f(auVar47 << 0x20,ZEXT416((uint)fVar246));
              fVar248 = local_640._0_4_;
              local_5a0._0_16_ = vrcp14ss_avx512f(auVar47 << 0x20,ZEXT416((uint)fVar246));
              auVar77 = vfnmadd213ss_fma(local_5a0._0_16_,local_580._0_16_,ZEXT416(0x40000000));
              local_5c0._0_4_ = auVar77._0_4_;
              local_7e0._0_4_ = auVar80._0_4_;
              if (fVar246 < -fVar246) {
                auVar253._0_4_ = sqrtf(fVar246);
                auVar253._4_60_ = extraout_var_00;
                auVar80 = ZEXT416((uint)local_7e0._0_4_);
                auVar81 = auVar253._0_16_;
                uVar62 = extraout_RAX_00;
                auVar77 = _local_7c0;
              }
              else {
                auVar81 = vsqrtss_avx512f(local_580._0_16_,local_580._0_16_);
                auVar77 = _local_7c0;
              }
              fVar218 = local_640._0_4_;
              fVar246 = fVar248 * 1.5 + fVar246 * -0.5 * fVar218 * fVar218 * fVar218;
              local_640._0_4_ = auVar77._0_4_ * fVar246;
              local_640._4_4_ = auVar77._4_4_ * fVar246;
              local_640._8_4_ = auVar77._8_4_ * fVar246;
              local_640._12_4_ = auVar77._12_4_ * fVar246;
              auVar2 = vdpps_avx(local_700._0_16_,local_640._0_16_,0x7f);
              fVar219 = auVar80._0_4_;
              fVar248 = auVar2._0_4_;
              auVar147._0_4_ = fVar248 * fVar248;
              auVar147._4_4_ = auVar2._4_4_ * auVar2._4_4_;
              auVar147._8_4_ = auVar2._8_4_ * auVar2._8_4_;
              auVar147._12_4_ = auVar2._12_4_ * auVar2._12_4_;
              auVar83 = vsubps_avx(local_720._0_16_,auVar147);
              fVar218 = auVar83._0_4_;
              auVar171._4_12_ = ZEXT812(0) << 0x20;
              auVar171._0_4_ = fVar218;
              auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
              auVar68 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
              auVar69 = vmulss_avx512f(auVar83,ZEXT416(0xbf000000));
              if (fVar218 < 0.0) {
                local_5e0._0_4_ = auVar68._0_4_;
                local_600 = fVar246;
                fStack_5fc = fVar246;
                fStack_5f8 = fVar246;
                fStack_5f4 = fVar246;
                local_5f0 = auVar73;
                fVar218 = sqrtf(fVar218);
                auVar69 = ZEXT416(auVar69._0_4_);
                auVar68 = ZEXT416((uint)local_5e0._0_4_);
                auVar81 = ZEXT416(auVar81._0_4_);
                auVar80 = ZEXT416((uint)local_7e0._0_4_);
                uVar62 = extraout_RAX_01;
                auVar77 = _local_7c0;
                auVar73 = local_5f0;
                fVar246 = local_600;
                fVar220 = fStack_5fc;
                fVar229 = fStack_5f8;
                fVar230 = fStack_5f4;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
                fVar218 = auVar83._0_4_;
                fVar220 = fVar246;
                fVar229 = fVar246;
                fVar230 = fVar246;
              }
              auVar257 = ZEXT1664(auVar77);
              auVar253 = ZEXT1664(local_720._0_16_);
              auVar249 = ZEXT1664(local_700._0_16_);
              auVar264 = ZEXT3264(local_800);
              auVar265 = ZEXT3264(local_820);
              auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar82,auVar76);
              auVar76 = vfmadd231ss_fma(auVar82,auVar76,SUB6416(ZEXT464(0xc0000000),0));
              auVar191._0_4_ = fVar243 * (float)local_6c0._0_4_;
              auVar191._4_4_ = fVar243 * (float)local_6c0._4_4_;
              auVar191._8_4_ = fVar243 * fStack_6b8;
              auVar191._12_4_ = fVar243 * fStack_6b4;
              auVar213._0_4_ = auVar76._0_4_;
              auVar213._4_4_ = auVar213._0_4_;
              auVar213._8_4_ = auVar213._0_4_;
              auVar213._12_4_ = auVar213._0_4_;
              auVar76 = vfmadd132ps_fma(auVar213,auVar191,local_680._0_16_);
              auVar172._0_4_ = auVar83._0_4_;
              auVar172._4_4_ = auVar172._0_4_;
              auVar172._8_4_ = auVar172._0_4_;
              auVar172._12_4_ = auVar172._0_4_;
              auVar76 = vfmadd132ps_fma(auVar172,auVar76,local_6a0._0_16_);
              auVar76 = vfmadd132ps_fma(_local_560,auVar76,local_660._0_16_);
              auVar173._0_4_ = auVar76._0_4_ * (float)local_580._0_4_;
              auVar173._4_4_ = auVar76._4_4_ * (float)local_580._0_4_;
              auVar173._8_4_ = auVar76._8_4_ * (float)local_580._0_4_;
              auVar173._12_4_ = auVar76._12_4_ * (float)local_580._0_4_;
              auVar76 = vdpps_avx(auVar77,auVar76,0x7f);
              fVar186 = auVar76._0_4_;
              auVar192._0_4_ = auVar77._0_4_ * fVar186;
              auVar192._4_4_ = auVar77._4_4_ * fVar186;
              auVar192._8_4_ = auVar77._8_4_ * fVar186;
              auVar192._12_4_ = auVar77._12_4_ * fVar186;
              auVar76 = vsubps_avx(auVar173,auVar192);
              fVar186 = (float)local_5c0._0_4_ * (float)local_5a0._0_4_;
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar70 = vxorps_avx512vl(auVar77,auVar23);
              auVar225._0_4_ = fVar246 * auVar76._0_4_ * fVar186;
              auVar225._4_4_ = fVar220 * auVar76._4_4_ * fVar186;
              auVar225._8_4_ = fVar229 * auVar76._8_4_ * fVar186;
              auVar225._12_4_ = fVar230 * auVar76._12_4_ * fVar186;
              auVar76 = vdpps_avx(auVar70,local_640._0_16_,0x7f);
              auVar83 = vmaxss_avx(ZEXT416((uint)fVar247),
                                   ZEXT416((uint)((float)local_7a0._0_4_ * (float)local_770._0_4_)))
              ;
              auVar82 = vdivss_avx512f(ZEXT416((uint)fVar247),auVar81);
              auVar81 = vdpps_avx(local_700._0_16_,auVar225,0x7f);
              auVar80 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar247),auVar83);
              auVar82 = vfmadd213ss_fma(ZEXT416((uint)(fVar219 + 1.0)),auVar82,auVar80);
              auVar80 = vdpps_avx(local_6d0,local_640._0_16_,0x7f);
              fVar246 = auVar76._0_4_ + auVar81._0_4_;
              auVar76 = vdpps_avx(local_700._0_16_,auVar70,0x7f);
              auVar69 = vmulss_avx512f(auVar69,auVar73);
              auVar73 = vmulss_avx512f(auVar73,auVar73);
              auVar81 = vdpps_avx(local_700._0_16_,local_6d0,0x7f);
              auVar69 = vaddss_avx512f(auVar68,ZEXT416((uint)(auVar69._0_4_ * auVar73._0_4_)));
              auVar73 = vfnmadd231ss_fma(auVar76,auVar2,ZEXT416((uint)fVar246));
              auVar68 = vfnmadd231ss_fma(auVar81,auVar2,auVar80);
              auVar76 = vpermilps_avx(local_540._0_16_,0xff);
              fVar218 = fVar218 - auVar76._0_4_;
              auVar76 = vshufps_avx(auVar77,auVar77,0xff);
              auVar81 = vfmsub213ss_fma(auVar73,auVar69,auVar76);
              fVar219 = auVar68._0_4_ * auVar69._0_4_;
              auVar73 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar81._0_4_)),
                                        ZEXT416((uint)fVar246),ZEXT416((uint)fVar219));
              auVar242 = ZEXT1664(auVar73);
              fVar220 = auVar73._0_4_;
              fVar243 = fVar243 - (fVar248 * (fVar219 / fVar220) -
                                  fVar218 * (auVar80._0_4_ / fVar220));
              fVar246 = (float)local_7a0._0_4_ -
                        (fVar218 * (fVar246 / fVar220) - fVar248 * (auVar81._0_4_ / fVar220));
              auVar245 = ZEXT464((uint)fVar246);
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar80 = vandps_avx512vl(auVar2,auVar24);
              if (auVar80._0_4_ < auVar82._0_4_) {
                auVar80 = vfmadd231ss_fma(ZEXT416((uint)(auVar82._0_4_ + auVar83._0_4_)),local_610,
                                          ZEXT416(0x36000000));
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar81 = vandps_avx512vl(ZEXT416((uint)fVar218),auVar25);
                if (auVar81._0_4_ < auVar80._0_4_) {
                  bVar61 = uVar58 < 5;
                  fVar247 = fVar246 + (float)local_620._0_4_;
                  if ((fVar16 <= fVar247) &&
                     (fVar248 = *(float *)(ray + k * 4 + 0x80), fVar247 <= fVar248)) {
                    bVar53 = 0;
                    if ((fVar243 < 0.0) || (1.0 < fVar243)) goto LAB_018d37b2;
                    auVar193._4_12_ = SUB1612(ZEXT816(0),0);
                    auVar193._0_4_ = local_720._0_4_;
                    auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar193);
                    fVar218 = auVar80._0_4_;
                    pGVar3 = (context->scene->geometries).items[local_758].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar53 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_018d37b2;
                      fVar218 = fVar218 * 1.5 + local_720._0_4_ * -0.5 * fVar218 * fVar218 * fVar218
                      ;
                      auVar194._0_4_ = local_700._0_4_ * fVar218;
                      auVar194._4_4_ = local_700._4_4_ * fVar218;
                      auVar194._8_4_ = local_700._8_4_ * fVar218;
                      auVar194._12_4_ = local_700._12_4_ * fVar218;
                      auVar2 = vfmadd213ps_fma(auVar76,auVar194,auVar77);
                      auVar76 = vshufps_avx(auVar194,auVar194,0xc9);
                      auVar80 = vshufps_avx(auVar77,auVar77,0xc9);
                      auVar195._0_4_ = auVar194._0_4_ * auVar80._0_4_;
                      auVar195._4_4_ = auVar194._4_4_ * auVar80._4_4_;
                      auVar195._8_4_ = auVar194._8_4_ * auVar80._8_4_;
                      auVar195._12_4_ = auVar194._12_4_ * auVar80._12_4_;
                      auVar81 = vfmsub231ps_fma(auVar195,auVar77,auVar76);
                      auVar76 = vshufps_avx(auVar81,auVar81,0xc9);
                      auVar80 = vshufps_avx(auVar2,auVar2,0xc9);
                      auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                      auVar148._0_4_ = auVar2._0_4_ * auVar81._0_4_;
                      auVar148._4_4_ = auVar2._4_4_ * auVar81._4_4_;
                      auVar148._8_4_ = auVar2._8_4_ * auVar81._8_4_;
                      auVar148._12_4_ = auVar2._12_4_ * auVar81._12_4_;
                      auVar76 = vfmsub231ps_fma(auVar148,auVar76,auVar80);
                      local_4e0 = (RTCHitN  [16])vshufps_avx(auVar76,auVar76,0x55);
                      auStack_4d0 = vshufps_avx(auVar76,auVar76,0xaa);
                      local_4c0 = auVar76._0_4_;
                      uStack_4bc = local_4c0;
                      uStack_4b8 = local_4c0;
                      uStack_4b4 = local_4c0;
                      local_4b0 = fVar243;
                      fStack_4ac = fVar243;
                      fStack_4a8 = fVar243;
                      fStack_4a4 = fVar243;
                      local_4a0 = ZEXT416(0) << 0x20;
                      local_490 = local_4f0._0_8_;
                      uStack_488 = local_4f0._8_8_;
                      local_480 = local_500;
                      vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                      uStack_46c = context->user->instID[0];
                      local_470 = uStack_46c;
                      uStack_468 = uStack_46c;
                      uStack_464 = uStack_46c;
                      uStack_460 = context->user->instPrimID[0];
                      uStack_45c = uStack_460;
                      uStack_458 = uStack_460;
                      uStack_454 = uStack_460;
                      *(float *)(ray + k * 4 + 0x80) = fVar247;
                      local_860 = local_510;
                      local_750.valid = (int *)local_860;
                      local_750.geometryUserPtr = pGVar3->userPtr;
                      local_750.context = context->user;
                      local_750.hit = local_4e0;
                      local_750.N = 4;
                      local_750.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar242 = ZEXT1664(auVar73);
                        auVar245 = ZEXT464((uint)fVar246);
                        auVar249 = ZEXT1664(local_700._0_16_);
                        auVar253 = ZEXT1664(local_720._0_16_);
                        auVar257 = ZEXT1664(auVar77);
                        (*pGVar3->occlusionFilterN)(&local_750);
                        auVar265 = ZEXT3264(local_820);
                        auVar264 = ZEXT3264(local_800);
                      }
                      uVar62 = vptestmd_avx512vl(local_860,local_860);
                      if ((uVar62 & 0xf) == 0) {
                        auVar184 = ZEXT3264(local_840);
                      }
                      else {
                        p_Var7 = context->args->filter;
                        if (p_Var7 == (RTCFilterFunctionN)0x0) {
                          auVar184 = ZEXT3264(local_840);
                        }
                        else {
                          auVar184 = ZEXT3264(local_840);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar3->field_8).field_0x2 & 0x40) != 0)) {
                            auVar242 = ZEXT1664(auVar242._0_16_);
                            auVar245 = ZEXT1664(auVar245._0_16_);
                            auVar249 = ZEXT1664(auVar249._0_16_);
                            auVar253 = ZEXT1664(auVar253._0_16_);
                            auVar257 = ZEXT1664(auVar257._0_16_);
                            (*p_Var7)(&local_750);
                            auVar184 = ZEXT3264(local_840);
                            auVar265 = ZEXT3264(local_820);
                            auVar264 = ZEXT3264(local_800);
                          }
                        }
                        uVar62 = vptestmd_avx512vl(local_860,local_860);
                        uVar62 = uVar62 & 0xf;
                        auVar76 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar8 = (bool)((byte)uVar62 & 1);
                        bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
                        bVar11 = SUB81(uVar62 >> 3,0);
                        *(uint *)(local_750.ray + 0x80) =
                             (uint)bVar8 * auVar76._0_4_ |
                             (uint)!bVar8 * *(int *)(local_750.ray + 0x80);
                        *(uint *)(local_750.ray + 0x84) =
                             (uint)bVar9 * auVar76._4_4_ |
                             (uint)!bVar9 * *(int *)(local_750.ray + 0x84);
                        *(uint *)(local_750.ray + 0x88) =
                             (uint)bVar10 * auVar76._8_4_ |
                             (uint)!bVar10 * *(int *)(local_750.ray + 0x88);
                        *(uint *)(local_750.ray + 0x8c) =
                             (uint)bVar11 * auVar76._12_4_ |
                             (uint)!bVar11 * *(int *)(local_750.ray + 0x8c);
                        bVar53 = 1;
                        if ((byte)uVar62 != 0) goto LAB_018d37bb;
                      }
                      *(float *)(ray + k * 4 + 0x80) = fVar248;
                      bVar53 = 0;
                      goto LAB_018d37bb;
                    }
                  }
                  bVar53 = 0;
                  goto LAB_018d37b2;
                }
              }
              uVar58 = uVar58 + 1;
            }
            bVar61 = false;
LAB_018d37b2:
            auVar184 = ZEXT3264(local_840);
LAB_018d37bb:
            bVar54 = bVar54 | bVar61 & bVar53;
            uVar165 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar233._4_4_ = uVar165;
            auVar233._0_4_ = uVar165;
            auVar233._8_4_ = uVar165;
            auVar233._12_4_ = uVar165;
            auVar233._16_4_ = uVar165;
            auVar233._20_4_ = uVar165;
            auVar233._24_4_ = uVar165;
            auVar233._28_4_ = uVar165;
            auVar235 = ZEXT3264(auVar233);
            auVar49._4_4_ = fStack_39c;
            auVar49._0_4_ = local_3a0;
            auVar49._8_4_ = fStack_398;
            auVar49._12_4_ = fStack_394;
            auVar49._16_4_ = fStack_390;
            auVar49._20_4_ = fStack_38c;
            auVar49._24_4_ = fStack_388;
            auVar49._28_4_ = fStack_384;
            uVar19 = vcmpps_avx512vl(auVar233,auVar49,0xd);
          }
          auVar155._0_4_ = (float)local_3e0._0_4_ + (float)local_3c0._0_4_;
          auVar155._4_4_ = (float)local_3e0._4_4_ + (float)local_3c0._4_4_;
          auVar155._8_4_ = fStack_3d8 + fStack_3b8;
          auVar155._12_4_ = fStack_3d4 + fStack_3b4;
          auVar155._16_4_ = fStack_3d0 + fStack_3b0;
          auVar155._20_4_ = fStack_3cc + fStack_3ac;
          auVar155._24_4_ = fStack_3c8 + fStack_3a8;
          auVar155._28_4_ = fStack_3c4 + fStack_3a4;
          uVar165 = auVar235._0_4_;
          auVar180._4_4_ = uVar165;
          auVar180._0_4_ = uVar165;
          auVar180._8_4_ = uVar165;
          auVar180._12_4_ = uVar165;
          auVar180._16_4_ = uVar165;
          auVar180._20_4_ = uVar165;
          auVar180._24_4_ = uVar165;
          auVar180._28_4_ = uVar165;
          uVar19 = vcmpps_avx512vl(auVar155,auVar180,2);
          auVar156._8_4_ = 2;
          auVar156._0_8_ = 0x200000002;
          auVar156._12_4_ = 2;
          auVar156._16_4_ = 2;
          auVar156._20_4_ = 2;
          auVar156._24_4_ = 2;
          auVar156._28_4_ = 2;
          auVar32._8_4_ = 3;
          auVar32._0_8_ = 0x300000003;
          auVar32._12_4_ = 3;
          auVar32._16_4_ = 3;
          auVar32._20_4_ = 3;
          auVar32._24_4_ = 3;
          auVar32._28_4_ = 3;
          auVar97 = vpblendmd_avx512vl(auVar156,auVar32);
          bVar61 = (bool)((byte)local_850 & 1);
          local_3c0._0_4_ = (uint)bVar61 * auVar97._0_4_ | (uint)!bVar61 * 2;
          bVar61 = (bool)((byte)(local_850 >> 1) & 1);
          local_3c0._4_4_ = (uint)bVar61 * auVar97._4_4_ | (uint)!bVar61 * 2;
          bVar61 = (bool)((byte)(local_850 >> 2) & 1);
          fStack_3b8 = (float)((uint)bVar61 * auVar97._8_4_ | (uint)!bVar61 * 2);
          bVar61 = (bool)((byte)(local_850 >> 3) & 1);
          fStack_3b4 = (float)((uint)bVar61 * auVar97._12_4_ | (uint)!bVar61 * 2);
          bVar61 = (bool)((byte)(local_850 >> 4) & 1);
          fStack_3b0 = (float)((uint)bVar61 * auVar97._16_4_ | (uint)!bVar61 * 2);
          bVar61 = (bool)((byte)(local_850 >> 5) & 1);
          fStack_3ac = (float)((uint)bVar61 * auVar97._20_4_ | (uint)!bVar61 * 2);
          bVar61 = (bool)((byte)(local_850 >> 6) & 1);
          fStack_3a8 = (float)((uint)bVar61 * auVar97._24_4_ | (uint)!bVar61 * 2);
          bVar61 = (bool)((byte)(local_850 >> 7) & 1);
          fStack_3a4 = (float)((uint)bVar61 * auVar97._28_4_ | (uint)!bVar61 * 2);
          bVar52 = (byte)uVar20 & bVar52 & (byte)uVar19;
          uVar19 = vpcmpd_avx512vl(_local_3c0,local_360,2);
          local_840 = _local_340;
          local_3a0 = (float)local_3e0._0_4_ + (float)local_340._0_4_;
          fStack_39c = (float)local_3e0._4_4_ + (float)local_340._4_4_;
          fStack_398 = fStack_3d8 + fStack_338;
          fStack_394 = fStack_3d4 + fStack_334;
          fStack_390 = fStack_3d0 + fStack_330;
          fStack_38c = fStack_3cc + fStack_32c;
          fStack_388 = fStack_3c8 + fStack_328;
          fStack_384 = fStack_3c4 + fStack_324;
          for (bVar59 = (byte)uVar19 & bVar52; bVar59 != 0; bVar59 = ~bVar56 & bVar59 & (byte)uVar19
              ) {
            auVar157._8_4_ = 0x7f800000;
            auVar157._0_8_ = 0x7f8000007f800000;
            auVar157._12_4_ = 0x7f800000;
            auVar157._16_4_ = 0x7f800000;
            auVar157._20_4_ = 0x7f800000;
            auVar157._24_4_ = 0x7f800000;
            auVar157._28_4_ = 0x7f800000;
            auVar97 = vblendmps_avx512vl(auVar157,local_840);
            auVar133._0_4_ =
                 (uint)(bVar59 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar59 & 1) * 0x7f800000;
            bVar61 = (bool)(bVar59 >> 1 & 1);
            auVar133._4_4_ = (uint)bVar61 * auVar97._4_4_ | (uint)!bVar61 * 0x7f800000;
            bVar61 = (bool)(bVar59 >> 2 & 1);
            auVar133._8_4_ = (uint)bVar61 * auVar97._8_4_ | (uint)!bVar61 * 0x7f800000;
            bVar61 = (bool)(bVar59 >> 3 & 1);
            auVar133._12_4_ = (uint)bVar61 * auVar97._12_4_ | (uint)!bVar61 * 0x7f800000;
            bVar61 = (bool)(bVar59 >> 4 & 1);
            auVar133._16_4_ = (uint)bVar61 * auVar97._16_4_ | (uint)!bVar61 * 0x7f800000;
            bVar61 = (bool)(bVar59 >> 5 & 1);
            auVar133._20_4_ = (uint)bVar61 * auVar97._20_4_ | (uint)!bVar61 * 0x7f800000;
            auVar133._24_4_ =
                 (uint)(bVar59 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar59 >> 6) * 0x7f800000;
            auVar133._28_4_ = 0x7f800000;
            auVar97 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar97 = vminps_avx(auVar133,auVar97);
            auVar94 = vshufpd_avx(auVar97,auVar97,5);
            auVar97 = vminps_avx(auVar97,auVar94);
            auVar94 = vpermpd_avx2(auVar97,0x4e);
            auVar97 = vminps_avx(auVar97,auVar94);
            uVar19 = vcmpps_avx512vl(auVar133,auVar97,0);
            bVar53 = (byte)uVar19 & bVar59;
            bVar56 = bVar59;
            if (bVar53 != 0) {
              bVar56 = bVar53;
            }
            iVar22 = 0;
            for (uVar63 = (uint)bVar56; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            bVar56 = '\x01' << ((byte)iVar22 & 0x1f);
            fVar243 = *(float *)(local_200 + (uint)(iVar22 << 2));
            auVar245 = ZEXT464(*(uint *)(local_320 + (uint)(iVar22 << 2)));
            fVar246 = local_844;
            if ((float)local_6e0._0_4_ < 0.0) {
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_320 + (uint)(iVar22 << 2)));
              auVar242 = ZEXT1664(auVar242._0_16_);
              auVar249 = ZEXT1664(auVar249._0_16_);
              auVar253 = ZEXT1664(auVar253._0_16_);
              auVar257 = ZEXT1664(auVar257._0_16_);
              fVar246 = sqrtf((float)local_6e0._0_4_);
              auVar245 = ZEXT1664(local_7a0._0_16_);
              auVar265 = ZEXT3264(local_820);
              auVar264 = ZEXT3264(local_800);
            }
            uVar62 = (ulong)bVar56;
            auVar80 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar76 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar77 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar81 = vminps_avx(auVar80,auVar77);
            auVar80 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar77 = vmaxps_avx(auVar76,auVar80);
            auVar214._8_4_ = 0x7fffffff;
            auVar214._0_8_ = 0x7fffffff7fffffff;
            auVar214._12_4_ = 0x7fffffff;
            auVar76 = vandps_avx(auVar81,auVar214);
            auVar80 = vandps_avx(auVar77,auVar214);
            auVar76 = vmaxps_avx(auVar76,auVar80);
            auVar80 = vmovshdup_avx(auVar76);
            auVar80 = vmaxss_avx(auVar80,auVar76);
            auVar76 = vshufpd_avx(auVar76,auVar76,1);
            auVar76 = vmaxss_avx(auVar76,auVar80);
            local_640._0_4_ = auVar76._0_4_ * 1.9073486e-06;
            local_610 = vshufps_avx(auVar77,auVar77,0xff);
            uVar58 = 0;
            while( true ) {
              auVar76 = ZEXT416((uint)fVar243);
              bVar53 = (byte)uVar62;
              if (uVar58 == 5) break;
              local_7a0._0_16_ = auVar245._0_16_;
              uVar165 = auVar245._0_4_;
              auVar149._4_4_ = uVar165;
              auVar149._0_4_ = uVar165;
              auVar149._8_4_ = uVar165;
              auVar149._12_4_ = uVar165;
              auVar80 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_6d0);
              fVar230 = 1.0 - fVar243;
              fVar218 = fVar230 * fVar230 * fVar230;
              fVar247 = fVar243 * fVar243;
              fVar229 = fVar243 * fVar247;
              auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar218),
                                        ZEXT416((uint)fVar229));
              fVar248 = fVar243 * fVar230;
              auVar82 = ZEXT416((uint)fVar230);
              auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * fVar248 * 6.0)),
                                       ZEXT416((uint)(fVar248 * fVar230)),
                                       SUB6416(ZEXT464(0x41400000),0));
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar229),
                                        ZEXT416((uint)fVar218));
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * fVar230 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar243 * fVar248)));
              fVar218 = fVar218 * 0.16666667;
              fVar219 = (auVar77._0_4_ + auVar2._0_4_) * 0.16666667;
              fVar220 = (auVar81._0_4_ + auVar83._0_4_) * 0.16666667;
              fVar229 = fVar229 * 0.16666667;
              auVar196._0_4_ = fVar229 * (float)local_6c0._0_4_;
              auVar196._4_4_ = fVar229 * (float)local_6c0._4_4_;
              auVar196._8_4_ = fVar229 * fStack_6b8;
              auVar196._12_4_ = fVar229 * fStack_6b4;
              auVar226._4_4_ = fVar220;
              auVar226._0_4_ = fVar220;
              auVar226._8_4_ = fVar220;
              auVar226._12_4_ = fVar220;
              auVar77 = vfmadd132ps_fma(auVar226,auVar196,local_680._0_16_);
              auVar197._4_4_ = fVar219;
              auVar197._0_4_ = fVar219;
              auVar197._8_4_ = fVar219;
              auVar197._12_4_ = fVar219;
              auVar77 = vfmadd132ps_fma(auVar197,auVar77,local_6a0._0_16_);
              auVar174._4_4_ = fVar218;
              auVar174._0_4_ = fVar218;
              auVar174._8_4_ = fVar218;
              auVar174._12_4_ = fVar218;
              auVar77 = vfmadd132ps_fma(auVar174,auVar77,local_660._0_16_);
              local_540._0_16_ = auVar77;
              auVar80 = vsubps_avx(auVar80,auVar77);
              local_700._0_16_ = auVar80;
              auVar80 = vdpps_avx(auVar80,auVar80,0x7f);
              local_720._0_16_ = auVar80;
              if (auVar80._0_4_ < 0.0) {
                local_7c0._0_4_ = fVar247;
                local_7e0._0_4_ = fVar248;
                auVar235._0_4_ = sqrtf(auVar80._0_4_);
                auVar235._4_60_ = extraout_var_01;
                auVar80 = auVar235._0_16_;
                uVar62 = extraout_RAX_02;
                fVar248 = (float)local_7e0._0_4_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar80,auVar80);
                local_7c0._0_4_ = fVar247;
              }
              local_560._4_4_ = fVar230;
              local_560._0_4_ = fVar230;
              fStack_558 = fVar230;
              fStack_554 = fVar230;
              auVar81 = vfnmsub213ss_fma(auVar76,auVar76,ZEXT416((uint)(fVar248 * 4.0)));
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * 4.0)),auVar82,auVar82);
              fVar247 = fVar230 * -fVar230 * 0.5;
              fVar248 = auVar81._0_4_ * 0.5;
              fVar218 = auVar77._0_4_ * 0.5;
              local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
              auVar215._0_4_ = (float)local_7c0._0_4_ * (float)local_6c0._0_4_;
              auVar215._4_4_ = (float)local_7c0._0_4_ * (float)local_6c0._4_4_;
              auVar215._8_4_ = (float)local_7c0._0_4_ * fStack_6b8;
              auVar215._12_4_ = (float)local_7c0._0_4_ * fStack_6b4;
              auVar175._4_4_ = fVar218;
              auVar175._0_4_ = fVar218;
              auVar175._8_4_ = fVar218;
              auVar175._12_4_ = fVar218;
              auVar77 = vfmadd132ps_fma(auVar175,auVar215,local_680._0_16_);
              auVar198._4_4_ = fVar248;
              auVar198._0_4_ = fVar248;
              auVar198._8_4_ = fVar248;
              auVar198._12_4_ = fVar248;
              auVar77 = vfmadd132ps_fma(auVar198,auVar77,local_6a0._0_16_);
              auVar255._4_4_ = fVar247;
              auVar255._0_4_ = fVar247;
              auVar255._8_4_ = fVar247;
              auVar255._12_4_ = fVar247;
              _local_7c0 = vfmadd132ps_fma(auVar255,auVar77,local_660._0_16_);
              local_580._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
              auVar48._12_4_ = 0;
              auVar48._0_12_ = ZEXT812(0);
              fVar247 = local_580._0_4_;
              auVar81 = vrsqrt14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar247));
              local_5a0._0_16_ = vrcp14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar247));
              auVar77 = vfnmadd213ss_fma(local_5a0._0_16_,local_580._0_16_,ZEXT416(0x40000000));
              local_5c0._0_4_ = auVar77._0_4_;
              local_7e0._0_4_ = auVar80._0_4_;
              if (fVar247 < -fVar247) {
                local_770 = auVar81;
                auVar245._0_4_ = sqrtf(fVar247);
                auVar245._4_60_ = extraout_var_02;
                auVar80 = ZEXT416((uint)local_7e0._0_4_);
                auVar83 = auVar245._0_16_;
                uVar62 = extraout_RAX_03;
                auVar77 = local_770;
                auVar2 = _local_7c0;
              }
              else {
                auVar83 = vsqrtss_avx512f(local_580._0_16_,local_580._0_16_);
                auVar77 = auVar81;
                auVar2 = _local_7c0;
              }
              fVar248 = auVar77._0_4_;
              fVar247 = auVar81._0_4_ * 1.5 + fVar247 * -0.5 * fVar248 * fVar248 * fVar248;
              auVar263._0_4_ = auVar2._0_4_ * fVar247;
              auVar263._4_4_ = auVar2._4_4_ * fVar247;
              auVar263._8_4_ = auVar2._8_4_ * fVar247;
              auVar263._12_4_ = auVar2._12_4_ * fVar247;
              auVar77 = vdpps_avx(local_700._0_16_,auVar263,0x7f);
              fVar248 = auVar80._0_4_ + 1.0;
              fVar218 = auVar77._0_4_;
              auVar150._0_4_ = fVar218 * fVar218;
              auVar150._4_4_ = auVar77._4_4_ * auVar77._4_4_;
              auVar150._8_4_ = auVar77._8_4_ * auVar77._8_4_;
              auVar150._12_4_ = auVar77._12_4_ * auVar77._12_4_;
              auVar81 = vsubps_avx(local_720._0_16_,auVar150);
              fVar219 = auVar81._0_4_;
              auVar176._4_12_ = ZEXT812(0) << 0x20;
              auVar176._0_4_ = fVar219;
              auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar176);
              auVar68 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
              auVar69 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
              if (fVar219 < 0.0) {
                local_770._0_4_ = fVar248;
                local_600 = fVar247;
                fStack_5fc = fVar247;
                fStack_5f8 = fVar247;
                fStack_5f4 = fVar247;
                local_5f0 = auVar263;
                local_5e0 = auVar73;
                fVar219 = sqrtf(fVar219);
                auVar69 = ZEXT416(auVar69._0_4_);
                auVar68 = ZEXT416(auVar68._0_4_);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar80 = ZEXT416((uint)local_7e0._0_4_);
                uVar62 = extraout_RAX_04;
                auVar2 = _local_7c0;
                fVar248 = (float)local_770._0_4_;
                auVar263 = local_5f0;
                auVar73 = local_5e0;
                fVar247 = local_600;
                fVar220 = fStack_5fc;
                fVar229 = fStack_5f8;
                fVar230 = fStack_5f4;
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
                fVar219 = auVar81._0_4_;
                fVar220 = fVar247;
                fVar229 = fVar247;
                fVar230 = fVar247;
              }
              auVar257 = ZEXT1664(auVar2);
              auVar253 = ZEXT1664(local_720._0_16_);
              auVar249 = ZEXT1664(local_700._0_16_);
              auVar264 = ZEXT3264(local_800);
              auVar265 = ZEXT3264(local_820);
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar82,auVar76);
              auVar76 = vfmadd231ss_fma(auVar82,auVar76,SUB6416(ZEXT464(0xc0000000),0));
              auVar199._0_4_ = fVar243 * (float)local_6c0._0_4_;
              auVar199._4_4_ = fVar243 * (float)local_6c0._4_4_;
              auVar199._8_4_ = fVar243 * fStack_6b8;
              auVar199._12_4_ = fVar243 * fStack_6b4;
              auVar216._0_4_ = auVar76._0_4_;
              auVar216._4_4_ = auVar216._0_4_;
              auVar216._8_4_ = auVar216._0_4_;
              auVar216._12_4_ = auVar216._0_4_;
              auVar76 = vfmadd132ps_fma(auVar216,auVar199,local_680._0_16_);
              auVar177._0_4_ = auVar81._0_4_;
              auVar177._4_4_ = auVar177._0_4_;
              auVar177._8_4_ = auVar177._0_4_;
              auVar177._12_4_ = auVar177._0_4_;
              auVar76 = vfmadd132ps_fma(auVar177,auVar76,local_6a0._0_16_);
              auVar76 = vfmadd132ps_fma(_local_560,auVar76,local_660._0_16_);
              auVar178._0_4_ = auVar76._0_4_ * (float)local_580._0_4_;
              auVar178._4_4_ = auVar76._4_4_ * (float)local_580._0_4_;
              auVar178._8_4_ = auVar76._8_4_ * (float)local_580._0_4_;
              auVar178._12_4_ = auVar76._12_4_ * (float)local_580._0_4_;
              auVar76 = vdpps_avx(auVar2,auVar76,0x7f);
              fVar186 = auVar76._0_4_;
              auVar200._0_4_ = auVar2._0_4_ * fVar186;
              auVar200._4_4_ = auVar2._4_4_ * fVar186;
              auVar200._8_4_ = auVar2._8_4_ * fVar186;
              auVar200._12_4_ = auVar2._12_4_ * fVar186;
              auVar76 = vsubps_avx(auVar178,auVar200);
              fVar186 = (float)local_5c0._0_4_ * (float)local_5a0._0_4_;
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar70 = vxorps_avx512vl(auVar2,auVar26);
              auVar227._0_4_ = fVar247 * auVar76._0_4_ * fVar186;
              auVar227._4_4_ = fVar220 * auVar76._4_4_ * fVar186;
              auVar227._8_4_ = fVar229 * auVar76._8_4_ * fVar186;
              auVar227._12_4_ = fVar230 * auVar76._12_4_ * fVar186;
              auVar76 = vdpps_avx(auVar70,auVar263,0x7f);
              auVar82 = vmaxss_avx(ZEXT416((uint)local_640._0_4_),
                                   ZEXT416((uint)((float)local_7a0._0_4_ * fVar246 * 1.9073486e-06))
                                  );
              auVar83 = vdivss_avx512f(ZEXT416((uint)local_640._0_4_),auVar83);
              auVar81 = vdpps_avx(local_700._0_16_,auVar227,0x7f);
              auVar80 = vfmadd213ss_fma(auVar80,ZEXT416((uint)local_640._0_4_),auVar82);
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)fVar248),auVar83,auVar80);
              auVar80 = vdpps_avx(local_6d0,auVar263,0x7f);
              fVar247 = auVar76._0_4_ + auVar81._0_4_;
              auVar76 = vdpps_avx(local_700._0_16_,auVar70,0x7f);
              auVar69 = vmulss_avx512f(auVar69,auVar73);
              auVar73 = vmulss_avx512f(auVar73,auVar73);
              auVar81 = vdpps_avx(local_700._0_16_,local_6d0,0x7f);
              auVar69 = vaddss_avx512f(auVar68,ZEXT416((uint)(auVar69._0_4_ * auVar73._0_4_)));
              auVar73 = vfnmadd231ss_fma(auVar76,auVar77,ZEXT416((uint)fVar247));
              auVar68 = vfnmadd231ss_fma(auVar81,auVar77,auVar80);
              auVar76 = vpermilps_avx(local_540._0_16_,0xff);
              fVar219 = fVar219 - auVar76._0_4_;
              auVar76 = vshufps_avx(auVar2,auVar2,0xff);
              auVar81 = vfmsub213ss_fma(auVar73,auVar69,auVar76);
              fVar248 = auVar68._0_4_ * auVar69._0_4_;
              auVar73 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar81._0_4_)),
                                        ZEXT416((uint)fVar247),ZEXT416((uint)fVar248));
              auVar242 = ZEXT1664(auVar73);
              fVar220 = auVar73._0_4_;
              fVar243 = fVar243 - (fVar218 * (fVar248 / fVar220) -
                                  fVar219 * (auVar80._0_4_ / fVar220));
              fVar247 = (float)local_7a0._0_4_ -
                        (fVar219 * (fVar247 / fVar220) - fVar218 * (auVar81._0_4_ / fVar220));
              auVar245 = ZEXT464((uint)fVar247);
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar80 = vandps_avx512vl(auVar77,auVar27);
              if (auVar80._0_4_ < auVar83._0_4_) {
                auVar80 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ + auVar82._0_4_)),local_610,
                                          ZEXT416(0x36000000));
                auVar28._8_4_ = 0x7fffffff;
                auVar28._0_8_ = 0x7fffffff7fffffff;
                auVar28._12_4_ = 0x7fffffff;
                auVar77 = vandps_avx512vl(ZEXT416((uint)fVar219),auVar28);
                if (auVar77._0_4_ < auVar80._0_4_) {
                  bVar61 = uVar58 < 5;
                  fVar246 = fVar247 + (float)local_620._0_4_;
                  if ((fVar16 <= fVar246) &&
                     (fVar248 = *(float *)(ray + k * 4 + 0x80), fVar246 <= fVar248)) {
                    bVar53 = 0;
                    if ((fVar243 < 0.0) || (1.0 < fVar243)) goto LAB_018d43ef;
                    auVar201._4_12_ = SUB1612(ZEXT816(0),0);
                    auVar201._0_4_ = local_720._0_4_;
                    auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar201);
                    fVar218 = auVar80._0_4_;
                    pGVar3 = (context->scene->geometries).items[local_758].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar53 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_018d43ef;
                      fVar218 = fVar218 * 1.5 + local_720._0_4_ * -0.5 * fVar218 * fVar218 * fVar218
                      ;
                      auVar202._0_4_ = local_700._0_4_ * fVar218;
                      auVar202._4_4_ = local_700._4_4_ * fVar218;
                      auVar202._8_4_ = local_700._8_4_ * fVar218;
                      auVar202._12_4_ = local_700._12_4_ * fVar218;
                      auVar81 = vfmadd213ps_fma(auVar76,auVar202,auVar2);
                      auVar76 = vshufps_avx(auVar202,auVar202,0xc9);
                      auVar80 = vshufps_avx(auVar2,auVar2,0xc9);
                      auVar203._0_4_ = auVar202._0_4_ * auVar80._0_4_;
                      auVar203._4_4_ = auVar202._4_4_ * auVar80._4_4_;
                      auVar203._8_4_ = auVar202._8_4_ * auVar80._8_4_;
                      auVar203._12_4_ = auVar202._12_4_ * auVar80._12_4_;
                      auVar77 = vfmsub231ps_fma(auVar203,auVar2,auVar76);
                      auVar76 = vshufps_avx(auVar77,auVar77,0xc9);
                      auVar80 = vshufps_avx(auVar81,auVar81,0xc9);
                      auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                      auVar151._0_4_ = auVar81._0_4_ * auVar77._0_4_;
                      auVar151._4_4_ = auVar81._4_4_ * auVar77._4_4_;
                      auVar151._8_4_ = auVar81._8_4_ * auVar77._8_4_;
                      auVar151._12_4_ = auVar81._12_4_ * auVar77._12_4_;
                      auVar76 = vfmsub231ps_fma(auVar151,auVar76,auVar80);
                      local_4e0 = (RTCHitN  [16])vshufps_avx(auVar76,auVar76,0x55);
                      auStack_4d0 = vshufps_avx(auVar76,auVar76,0xaa);
                      local_4c0 = auVar76._0_4_;
                      uStack_4bc = local_4c0;
                      uStack_4b8 = local_4c0;
                      uStack_4b4 = local_4c0;
                      local_4b0 = fVar243;
                      fStack_4ac = fVar243;
                      fStack_4a8 = fVar243;
                      fStack_4a4 = fVar243;
                      local_4a0 = ZEXT416(0) << 0x20;
                      local_490 = local_4f0._0_8_;
                      uStack_488 = local_4f0._8_8_;
                      local_480 = local_500;
                      vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                      uStack_46c = context->user->instID[0];
                      local_470 = uStack_46c;
                      uStack_468 = uStack_46c;
                      uStack_464 = uStack_46c;
                      uStack_460 = context->user->instPrimID[0];
                      uStack_45c = uStack_460;
                      uStack_458 = uStack_460;
                      uStack_454 = uStack_460;
                      *(float *)(ray + k * 4 + 0x80) = fVar246;
                      local_860 = local_510;
                      local_750.valid = (int *)local_860;
                      local_750.geometryUserPtr = pGVar3->userPtr;
                      local_750.context = context->user;
                      local_750.hit = local_4e0;
                      local_750.N = 4;
                      local_750.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar242 = ZEXT1664(auVar73);
                        auVar245 = ZEXT464((uint)fVar247);
                        auVar249 = ZEXT1664(local_700._0_16_);
                        auVar253 = ZEXT1664(local_720._0_16_);
                        auVar257 = ZEXT1664(auVar2);
                        (*pGVar3->occlusionFilterN)(&local_750);
                        auVar265 = ZEXT3264(local_820);
                        auVar264 = ZEXT3264(local_800);
                      }
                      uVar62 = vptestmd_avx512vl(local_860,local_860);
                      if ((uVar62 & 0xf) != 0) {
                        p_Var7 = context->args->filter;
                        if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar242 = ZEXT1664(auVar242._0_16_);
                          auVar245 = ZEXT1664(auVar245._0_16_);
                          auVar249 = ZEXT1664(auVar249._0_16_);
                          auVar253 = ZEXT1664(auVar253._0_16_);
                          auVar257 = ZEXT1664(auVar257._0_16_);
                          (*p_Var7)(&local_750);
                          auVar265 = ZEXT3264(local_820);
                          auVar264 = ZEXT3264(local_800);
                        }
                        uVar62 = vptestmd_avx512vl(local_860,local_860);
                        uVar62 = uVar62 & 0xf;
                        auVar76 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar8 = (bool)((byte)uVar62 & 1);
                        bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
                        bVar11 = SUB81(uVar62 >> 3,0);
                        *(uint *)(local_750.ray + 0x80) =
                             (uint)bVar8 * auVar76._0_4_ |
                             (uint)!bVar8 * *(int *)(local_750.ray + 0x80);
                        *(uint *)(local_750.ray + 0x84) =
                             (uint)bVar9 * auVar76._4_4_ |
                             (uint)!bVar9 * *(int *)(local_750.ray + 0x84);
                        *(uint *)(local_750.ray + 0x88) =
                             (uint)bVar10 * auVar76._8_4_ |
                             (uint)!bVar10 * *(int *)(local_750.ray + 0x88);
                        *(uint *)(local_750.ray + 0x8c) =
                             (uint)bVar11 * auVar76._12_4_ |
                             (uint)!bVar11 * *(int *)(local_750.ray + 0x8c);
                        bVar53 = 1;
                        if ((byte)uVar62 != 0) goto LAB_018d43ef;
                      }
                      *(float *)(ray + k * 4 + 0x80) = fVar248;
                    }
                  }
                  bVar53 = 0;
                  goto LAB_018d43ef;
                }
              }
              uVar58 = uVar58 + 1;
            }
            bVar61 = false;
LAB_018d43ef:
            bVar54 = bVar54 | bVar61 & bVar53;
            uVar165 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar234._4_4_ = uVar165;
            auVar234._0_4_ = uVar165;
            auVar234._8_4_ = uVar165;
            auVar234._12_4_ = uVar165;
            auVar234._16_4_ = uVar165;
            auVar234._20_4_ = uVar165;
            auVar234._24_4_ = uVar165;
            auVar234._28_4_ = uVar165;
            auVar235 = ZEXT3264(auVar234);
            auVar50._4_4_ = fStack_39c;
            auVar50._0_4_ = local_3a0;
            auVar50._8_4_ = fStack_398;
            auVar50._12_4_ = fStack_394;
            auVar50._16_4_ = fStack_390;
            auVar50._20_4_ = fStack_38c;
            auVar50._24_4_ = fStack_388;
            auVar50._28_4_ = fStack_384;
            uVar19 = vcmpps_avx512vl(auVar234,auVar50,0xd);
          }
          uVar21 = vpcmpd_avx512vl(local_360,local_300,1);
          uVar20 = vpcmpd_avx512vl(local_360,_local_3c0,1);
          auVar181._0_4_ = (float)local_3e0._0_4_ + (float)local_1c0._0_4_;
          auVar181._4_4_ = (float)local_3e0._4_4_ + (float)local_1c0._4_4_;
          auVar181._8_4_ = fStack_3d8 + fStack_1b8;
          auVar181._12_4_ = fStack_3d4 + fStack_1b4;
          auVar181._16_4_ = fStack_3d0 + fStack_1b0;
          auVar181._20_4_ = fStack_3cc + fStack_1ac;
          auVar181._24_4_ = fStack_3c8 + fStack_1a8;
          auVar181._28_4_ = fStack_3c4 + fStack_1a4;
          uVar165 = auVar235._0_4_;
          auVar205._4_4_ = uVar165;
          auVar205._0_4_ = uVar165;
          auVar205._8_4_ = uVar165;
          auVar205._12_4_ = uVar165;
          auVar205._16_4_ = uVar165;
          auVar205._20_4_ = uVar165;
          auVar205._24_4_ = uVar165;
          auVar205._28_4_ = uVar165;
          uVar19 = vcmpps_avx512vl(auVar181,auVar205,2);
          bVar59 = (byte)local_84c & (byte)uVar21 & (byte)uVar19;
          auVar217._0_4_ = (float)local_3e0._0_4_ + (float)local_340._0_4_;
          auVar217._4_4_ = (float)local_3e0._4_4_ + (float)local_340._4_4_;
          auVar217._8_4_ = fStack_3d8 + fStack_338;
          auVar217._12_4_ = fStack_3d4 + fStack_334;
          auVar217._16_4_ = fStack_3d0 + fStack_330;
          auVar217._20_4_ = fStack_3cc + fStack_32c;
          auVar217._24_4_ = fStack_3c8 + fStack_328;
          auVar217._28_4_ = fStack_3c4 + fStack_324;
          uVar19 = vcmpps_avx512vl(auVar217,auVar205,2);
          bVar52 = bVar52 & (byte)uVar20 & (byte)uVar19 | bVar59;
          if (bVar52 != 0) {
            abStack_180[uVar57 * 0x60] = bVar52;
            bVar61 = (bool)(bVar59 >> 1 & 1);
            bVar8 = (bool)(bVar59 >> 2 & 1);
            bVar9 = (bool)(bVar59 >> 3 & 1);
            bVar10 = (bool)(bVar59 >> 4 & 1);
            bVar11 = (bool)(bVar59 >> 5 & 1);
            bVar12 = (bool)(bVar59 >> 6 & 1);
            auStack_160[uVar57 * 0x18] =
                 (uint)(bVar59 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar59 & 1) * local_340._0_4_;
            auStack_160[uVar57 * 0x18 + 1] =
                 (uint)bVar61 * local_1c0._4_4_ | (uint)!bVar61 * local_340._4_4_;
            auStack_160[uVar57 * 0x18 + 2] =
                 (uint)bVar8 * (int)fStack_1b8 | (uint)!bVar8 * (int)fStack_338;
            auStack_160[uVar57 * 0x18 + 3] =
                 (uint)bVar9 * (int)fStack_1b4 | (uint)!bVar9 * (int)fStack_334;
            auStack_160[uVar57 * 0x18 + 4] =
                 (uint)bVar10 * (int)fStack_1b0 | (uint)!bVar10 * (int)fStack_330;
            auStack_160[uVar57 * 0x18 + 5] =
                 (uint)bVar11 * (int)fStack_1ac | (uint)!bVar11 * (int)fStack_32c;
            auStack_160[uVar57 * 0x18 + 6] =
                 (uint)bVar12 * (int)fStack_1a8 | (uint)!bVar12 * (int)fStack_328;
            auStack_160[uVar57 * 0x18 + 7] =
                 (uint)(bVar59 >> 7) * (int)fStack_1a4 |
                 (uint)!(bool)(bVar59 >> 7) * (int)fStack_324;
            uVar62 = vmovlps_avx(local_370);
            (&uStack_140)[uVar57 * 0xc] = uVar62;
            aiStack_138[uVar57 * 0x18] = local_a20 + 1;
            uVar57 = (ulong)((int)uVar57 + 1);
          }
          auVar235 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
        }
      }
    }
    do {
      uVar63 = (uint)uVar57;
      uVar57 = (ulong)(uVar63 - 1);
      if (uVar63 == 0) {
        if (bVar54 != 0) goto LAB_018d49cc;
        uVar165 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar29._4_4_ = uVar165;
        auVar29._0_4_ = uVar165;
        auVar29._8_4_ = uVar165;
        auVar29._12_4_ = uVar165;
        uVar19 = vcmpps_avx512vl(local_380,auVar29,2);
        local_5c8 = (ulong)((uint)uVar19 & (uint)local_5c8 - 1 & (uint)local_5c8);
        goto LAB_018d1fae;
      }
      auVar97 = *(undefined1 (*) [32])(auStack_160 + uVar57 * 0x18);
      auVar182._0_4_ = auVar97._0_4_ + (float)local_3e0._0_4_;
      auVar182._4_4_ = auVar97._4_4_ + (float)local_3e0._4_4_;
      auVar182._8_4_ = auVar97._8_4_ + fStack_3d8;
      auVar182._12_4_ = auVar97._12_4_ + fStack_3d4;
      auVar182._16_4_ = auVar97._16_4_ + fStack_3d0;
      auVar182._20_4_ = auVar97._20_4_ + fStack_3cc;
      auVar182._24_4_ = auVar97._24_4_ + fStack_3c8;
      auVar182._28_4_ = auVar97._28_4_ + fStack_3c4;
      uVar165 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar33._4_4_ = uVar165;
      auVar33._0_4_ = uVar165;
      auVar33._8_4_ = uVar165;
      auVar33._12_4_ = uVar165;
      auVar33._16_4_ = uVar165;
      auVar33._20_4_ = uVar165;
      auVar33._24_4_ = uVar165;
      auVar33._28_4_ = uVar165;
      uVar19 = vcmpps_avx512vl(auVar182,auVar33,2);
      uVar135 = (uint)uVar19 & (uint)abStack_180[uVar57 * 0x60];
    } while (uVar135 == 0);
    uVar62 = (&uStack_140)[uVar57 * 0xc];
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar62;
    auVar206._8_4_ = 0x7f800000;
    auVar206._0_8_ = 0x7f8000007f800000;
    auVar206._12_4_ = 0x7f800000;
    auVar206._16_4_ = 0x7f800000;
    auVar206._20_4_ = 0x7f800000;
    auVar206._24_4_ = 0x7f800000;
    auVar206._28_4_ = 0x7f800000;
    auVar94 = vblendmps_avx512vl(auVar206,auVar97);
    bVar52 = (byte)uVar135;
    auVar134._0_4_ =
         (uint)(bVar52 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar52 & 1) * (int)auVar97._0_4_;
    bVar61 = (bool)((byte)(uVar135 >> 1) & 1);
    auVar134._4_4_ = (uint)bVar61 * auVar94._4_4_ | (uint)!bVar61 * (int)auVar97._4_4_;
    bVar61 = (bool)((byte)(uVar135 >> 2) & 1);
    auVar134._8_4_ = (uint)bVar61 * auVar94._8_4_ | (uint)!bVar61 * (int)auVar97._8_4_;
    bVar61 = (bool)((byte)(uVar135 >> 3) & 1);
    auVar134._12_4_ = (uint)bVar61 * auVar94._12_4_ | (uint)!bVar61 * (int)auVar97._12_4_;
    bVar61 = (bool)((byte)(uVar135 >> 4) & 1);
    auVar134._16_4_ = (uint)bVar61 * auVar94._16_4_ | (uint)!bVar61 * (int)auVar97._16_4_;
    bVar61 = (bool)((byte)(uVar135 >> 5) & 1);
    auVar134._20_4_ = (uint)bVar61 * auVar94._20_4_ | (uint)!bVar61 * (int)auVar97._20_4_;
    bVar61 = (bool)((byte)(uVar135 >> 6) & 1);
    auVar134._24_4_ = (uint)bVar61 * auVar94._24_4_ | (uint)!bVar61 * (int)auVar97._24_4_;
    auVar134._28_4_ =
         (uVar135 >> 7) * auVar94._28_4_ | (uint)!SUB41(uVar135 >> 7,0) * (int)auVar97._28_4_;
    auVar97 = vshufps_avx(auVar134,auVar134,0xb1);
    auVar97 = vminps_avx(auVar134,auVar97);
    auVar94 = vshufpd_avx(auVar97,auVar97,5);
    auVar97 = vminps_avx(auVar97,auVar94);
    auVar94 = vpermpd_avx2(auVar97,0x4e);
    auVar97 = vminps_avx(auVar97,auVar94);
    uVar19 = vcmpps_avx512vl(auVar134,auVar97,0);
    bVar59 = (byte)uVar19 & bVar52;
    if (bVar59 != 0) {
      uVar135 = (uint)bVar59;
    }
    uVar136 = 0;
    for (; (uVar135 & 1) == 0; uVar135 = uVar135 >> 1 | 0x80000000) {
      uVar136 = uVar136 + 1;
    }
    local_a20 = aiStack_138[uVar57 * 0x18];
    bVar52 = ~('\x01' << ((byte)uVar136 & 0x1f)) & bVar52;
    abStack_180[uVar57 * 0x60] = bVar52;
    if (bVar52 == 0) {
      uVar63 = uVar63 - 1;
    }
    uVar165 = (undefined4)uVar62;
    auVar158._4_4_ = uVar165;
    auVar158._0_4_ = uVar165;
    auVar158._8_4_ = uVar165;
    auVar158._12_4_ = uVar165;
    auVar158._16_4_ = uVar165;
    auVar158._20_4_ = uVar165;
    auVar158._24_4_ = uVar165;
    auVar158._28_4_ = uVar165;
    auVar76 = vmovshdup_avx(auVar179);
    auVar76 = vsubps_avx(auVar76,auVar179);
    auVar183._0_4_ = auVar76._0_4_;
    auVar183._4_4_ = auVar183._0_4_;
    auVar183._8_4_ = auVar183._0_4_;
    auVar183._12_4_ = auVar183._0_4_;
    auVar183._16_4_ = auVar183._0_4_;
    auVar183._20_4_ = auVar183._0_4_;
    auVar183._24_4_ = auVar183._0_4_;
    auVar183._28_4_ = auVar183._0_4_;
    auVar76 = vfmadd132ps_fma(auVar183,auVar158,_DAT_01f7b040);
    _local_4e0 = ZEXT1632(auVar76);
    auVar184 = ZEXT864(*(ulong *)(local_4e0 + (ulong)uVar136 * 4));
    uVar57 = (ulong)uVar63;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }